

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O3

void test_read_num<short,int,int(*)(char_const**,short*)>
               (int num1,_func_int_char_ptr_ptr_short_ptr *read_f,bool is_ok)

{
  mp_type mVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  undefined1 *puVar7;
  char (*pacVar8) [16];
  byte *pbVar9;
  byte bVar10;
  char (*pacVar11) [16];
  undefined1 *puVar12;
  code *pcVar13;
  undefined4 extraout_EDX;
  undefined4 extraout_EDX_00;
  float fVar14;
  uint extraout_EDX_01;
  char *pcVar15;
  ulong uVar16;
  char *pcVar17;
  double dVar18;
  uint uVar19;
  byte *pbVar20;
  byte *pbVar21;
  char *pcVar22;
  undefined8 *puVar23;
  undefined1 *puVar24;
  char *pcVar25;
  byte *pbVar26;
  uint uVar27;
  uint *puVar28;
  ulong uVar29;
  char (*pacVar30) [16];
  char cVar31;
  char *pcVar32;
  undefined8 uVar33;
  short sVar34;
  byte *pbVar35;
  undefined8 *puVar36;
  ulong uVar37;
  char *pcVar38;
  undefined *puVar39;
  char *pcVar40;
  byte *pbVar41;
  bool bVar42;
  undefined1 auVar43 [16];
  char mp_nums [16] [16];
  char str [256];
  double dStack_17a0;
  undefined1 *puStack_1798;
  char acStack_1790 [256];
  undefined1 uStack_1690;
  undefined8 uStack_168f;
  undefined1 auStack_1687 [255];
  char (*pacStack_1588) [16];
  undefined8 uStack_1580;
  undefined *puStack_1578;
  code *pcStack_1570;
  double dStack_1568;
  byte *pbStack_1560;
  char acStack_1558 [256];
  byte abStack_1458 [16];
  byte abStack_1448 [248];
  long lStack_1350;
  ulong uStack_1348;
  char *pcStack_1340;
  char *pcStack_1338;
  char *pcStack_1330;
  code *pcStack_1328;
  char (*pacStack_1320) [16];
  char *pcStack_1318;
  float fStack_1310;
  undefined4 uStack_130c;
  double dStack_1308;
  double dStack_1300;
  char (*pacStack_12f8) [16];
  char acStack_12f0 [256];
  byte bStack_11f0;
  undefined8 uStack_11ef;
  char acStack_11e7 [255];
  long lStack_10e8;
  ulong uStack_10e0;
  char *pcStack_10d8;
  char *pcStack_10d0;
  char *pcStack_10c8;
  code *pcStack_10c0;
  char (*pacStack_10b8) [16];
  char *pcStack_10b0;
  float fStack_10a8;
  undefined4 uStack_10a4;
  double dStack_10a0;
  double dStack_1098;
  code *pcStack_1090;
  byte bStack_1088;
  undefined8 uStack_1087;
  char acStack_107f [247];
  char acStack_f88 [256];
  undefined1 auStack_e88 [8];
  undefined8 *puStack_e80;
  ulong uStack_e78;
  undefined8 *puStack_e70;
  long lStack_e68;
  undefined1 *puStack_e60;
  code *pcStack_e58;
  code *pcStack_e50;
  float fStack_e44;
  double dStack_e40;
  double dStack_e38;
  undefined8 *puStack_e30;
  char (*pacStack_e28) [16];
  byte bStack_e20;
  undefined1 auStack_e1f [2];
  undefined1 auStack_e1d [6];
  undefined8 auStack_e17 [30];
  char acStack_d20 [256];
  undefined1 auStack_c20 [8];
  char (*pacStack_c18) [16];
  char *pcStack_c10;
  char *pcStack_c08;
  char (*pacStack_c00) [16];
  long lStack_bf8;
  code *pcStack_bf0;
  float fStack_bdc;
  char (*pacStack_bd8) [16];
  int iStack_bcc;
  double dStack_bc8;
  double dStack_bc0;
  byte bStack_bb8;
  undefined8 uStack_bb7;
  char acStack_baf [247];
  char acStack_ab8 [256];
  undefined1 auStack_9b8 [8];
  ulong uStack_9b0;
  char *pcStack_9a8;
  long lStack_9a0;
  undefined1 *puStack_998;
  undefined1 *puStack_990;
  code *pcStack_988;
  uint uStack_974;
  ulong uStack_970;
  float fStack_964;
  ulong uStack_960;
  double dStack_958;
  byte bStack_950;
  undefined8 uStack_94f;
  undefined1 auStack_947 [247];
  char acStack_850 [256];
  char acStack_750 [8];
  byte *pbStack_748;
  byte *pbStack_740;
  byte *pbStack_738;
  char (*pacStack_730) [16];
  ulong uStack_728;
  code *pcStack_720;
  char (*pacStack_718) [16];
  float fStack_710;
  int iStack_70c;
  ulong uStack_708;
  double dStack_700;
  byte bStack_6f8;
  undefined8 uStack_6f7;
  byte abStack_6ef [247];
  char acStack_5f8 [256];
  undefined1 auStack_4f8 [8];
  ulong uStack_4f0;
  char *pcStack_4e8;
  undefined1 *puStack_4e0;
  long lStack_4d8;
  undefined1 *puStack_4d0;
  code *pcStack_4c8;
  uint uStack_4c0;
  float fStack_4bc;
  ulong uStack_4b8;
  ulong uStack_4b0;
  double dStack_4a8;
  byte bStack_4a0;
  undefined8 uStack_49f;
  undefined1 auStack_497 [247];
  char acStack_3a0 [256];
  undefined1 auStack_2a0 [8];
  byte *pbStack_298;
  byte *pbStack_290;
  ulong uStack_288;
  byte *pbStack_280;
  byte *pbStack_278;
  code *pcStack_270;
  uint local_25c;
  float local_258;
  undefined4 local_254;
  ulong local_250;
  ulong local_248;
  double local_240;
  byte local_238;
  undefined8 local_237;
  byte local_22f [247];
  char local_138 [256];
  byte local_38 [8];
  
  local_254 = SUB84(read_f,0);
  builtin_strncpy(local_138,"typed read of ",0xf);
  uVar37 = (ulong)num1;
  if (num1 < 0) {
    pcVar15 = "%lld";
    uVar16 = uVar37;
  }
  else {
    pcVar15 = "%llu";
    uVar16 = (ulong)(uint)num1;
  }
  pcStack_270 = (code *)0x136cd6;
  local_25c = num1;
  iVar2 = snprintf(local_138 + 0xe,0xf2,pcVar15,uVar16);
  pcVar40 = local_138 + 0xe + iVar2;
  iVar3 = 0;
  pcStack_270 = (code *)0x136cf5;
  iVar2 = snprintf(pcVar40,(long)local_38 - (long)pcVar40," into ");
  pcVar15 = (char *)(local_38 + -(long)(pcVar40 + iVar2));
  pcStack_270 = (code *)0x136d14;
  snprintf(pcVar40 + iVar2,(size_t)pcVar15,"int%zu_t",0x10);
  pcStack_270 = (code *)0x136d23;
  _space((FILE *)_stdout);
  pcStack_270 = (code *)0x136d3c;
  fwrite("# ",2,1,_stdout);
  pcStack_270 = (code *)0x136d4c;
  fputs(local_138,_stdout);
  pcStack_270 = (code *)0x136d59;
  fputc(10,_stdout);
  if (-1 < (int)local_25c) {
    pcStack_270 = (code *)0x136d6d;
    iVar3 = test_encode_uint_all_sizes((char (*) [16])&local_238,(ulong)(uint)num1);
  }
  pacVar11 = (char (*) [16])(&local_238 + (long)iVar3 * 0x10);
  pcStack_270 = (code *)0x136d8f;
  local_250 = uVar37;
  iVar2 = test_encode_int_all_sizes(pacVar11,uVar37);
  uVar19 = iVar3 + iVar2;
  if (uVar19 != 0 && SCARRY4(iVar3,iVar2) == (int)uVar19 < 0) {
    local_258 = (float)(int)local_25c;
    local_240 = (double)(int)local_25c;
    pbVar41 = (byte *)(ulong)uVar19;
    pbVar9 = (byte *)((long)&local_237 + 1);
    uVar37 = 0;
    do {
      uVar19 = (uint)pacVar11;
      lVar5 = uVar37 * 0x10;
      pbVar20 = &local_238 + lVar5;
      pcVar40 = (char *)(pbVar9 + -2);
      bVar10 = pbVar9[-2];
      uVar16 = (ulong)bVar10;
      uVar29 = (ulong)(uint)(int)(char)bVar10;
      mVar1 = mp_type_hint[uVar16];
      pbVar35 = pbVar9;
      if (mVar1 != MP_UINT) {
        if (mVar1 == MP_FLOAT) {
          if (bVar10 != 0xca) {
LAB_00137199:
            pcStack_270 = (code *)0x1371b8;
            __assert_fail("c == 0xca",
                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                          ,0x97e,"float mp_decode_float(const char **)");
          }
          uVar27 = *(uint *)(pbVar9 + -1);
          fVar14 = (float)(uVar27 >> 0x18 | (uVar27 & 0xff0000) >> 8 | (uVar27 & 0xff00) << 8 |
                          uVar27 << 0x18);
          if ((fVar14 == local_258) && (!NAN(fVar14) && !NAN(local_258))) {
            pbVar35 = pbVar9 + 3;
            goto LAB_00136eca;
          }
          pcStack_270 = (code *)0x1371bd;
          test_read_num<short,int,int(*)(char_const**,short*)>();
LAB_001371bd:
          pcStack_270 = (code *)0x1371c2;
          test_read_num<short,int,int(*)(char_const**,short*)>();
          goto LAB_001371c2;
        }
        if (mVar1 == MP_INT) {
          uVar16 = (ulong)(char)bVar10;
          uVar27 = 0x140cbc;
          switch(bVar10) {
          case 0xd0:
            uVar16 = (ulong)(char)pbVar9[-1];
            uVar19 = uVar27;
            break;
          case 0xd1:
            uVar16 = (ulong)(short)(*(ushort *)(pbVar9 + -1) << 8 | *(ushort *)(pbVar9 + -1) >> 8);
            pbVar35 = local_22f + lVar5 + -6;
            uVar19 = uVar27;
            break;
          case 0xd2:
            uVar19 = *(uint *)(pbVar9 + -1);
            uVar16 = (ulong)(int)(uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8
                                 | uVar19 << 0x18);
            pbVar35 = local_22f + lVar5 + -4;
            uVar19 = uVar27;
            break;
          case 0xd3:
            uVar16 = *(ulong *)(pbVar9 + -1);
            uVar16 = uVar16 >> 0x38 | (uVar16 & 0xff000000000000) >> 0x28 |
                     (uVar16 & 0xff0000000000) >> 0x18 | (uVar16 & 0xff00000000) >> 8 |
                     (uVar16 & 0xff000000) << 8 | (uVar16 & 0xff0000) << 0x18 |
                     (uVar16 & 0xff00) << 0x28 | uVar16 << 0x38;
            pbVar35 = local_22f + lVar5;
            uVar19 = uVar27;
            break;
          default:
            if (bVar10 < 0xe0) {
              pcStack_270 = (code *)0x13716b;
              test_read_num<short,int,int(*)(char_const**,short*)>();
              goto LAB_0013716b;
            }
            pbVar35 = local_22f + lVar5 + -8;
          }
          if (uVar16 != local_250) goto LAB_001371bd;
          goto LAB_00136f5f;
        }
        if (bVar10 != 0xcb) goto LAB_00137175;
        uVar16 = *(ulong *)(pbVar9 + -1);
        dVar18 = (double)(uVar16 >> 0x38 | (uVar16 & 0xff000000000000) >> 0x28 |
                          (uVar16 & 0xff0000000000) >> 0x18 | (uVar16 & 0xff00000000) >> 8 |
                          (uVar16 & 0xff000000) << 8 | (uVar16 & 0xff0000) << 0x18 |
                          (uVar16 & 0xff00) << 0x28 | uVar16 << 0x38);
        if ((dVar18 != local_240) || (NAN(dVar18) || NAN(local_240))) {
          pcStack_270 = (code *)0x137199;
          test_read_num<short,int,int(*)(char_const**,short*)>();
          goto LAB_00137199;
        }
        pbVar35 = local_22f + lVar5;
        goto LAB_00136eca;
      }
      uVar27 = 0x140cac;
      switch(bVar10) {
      case 0xcc:
        uVar16 = (ulong)pbVar9[-1];
        uVar19 = uVar27;
        break;
      case 0xcd:
        uVar16 = (ulong)(ushort)(*(ushort *)(pbVar9 + -1) << 8 | *(ushort *)(pbVar9 + -1) >> 8);
        pbVar35 = local_22f + lVar5 + -6;
        uVar19 = uVar27;
        break;
      case 0xce:
        uVar19 = *(uint *)(pbVar9 + -1);
        uVar16 = (ulong)(uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                        uVar19 << 0x18);
        pbVar35 = local_22f + lVar5 + -4;
        uVar19 = uVar27;
        break;
      case 0xcf:
        uVar16 = *(ulong *)(pbVar9 + -1);
        uVar16 = uVar16 >> 0x38 | (uVar16 & 0xff000000000000) >> 0x28 |
                 (uVar16 & 0xff0000000000) >> 0x18 | (uVar16 & 0xff00000000) >> 8 |
                 (uVar16 & 0xff000000) << 8 | (uVar16 & 0xff0000) << 0x18 |
                 (uVar16 & 0xff00) << 0x28 | uVar16 << 0x38;
        pbVar35 = local_22f + lVar5;
        uVar19 = uVar27;
        break;
      default:
        if (-1 < (char)bVar10) {
          pbVar35 = local_22f + lVar5 + -8;
          break;
        }
LAB_0013716b:
        pcStack_270 = (code *)0x137170;
        test_read_num<short,int,int(*)(char_const**,short*)>();
        goto LAB_00137170;
      }
      if (uVar16 != local_250) {
LAB_001371c2:
        pcStack_270 = (code *)0x1371c7;
        test_read_num<short,int,int(*)(char_const**,short*)>();
        pbVar35 = pbVar41;
        goto LAB_001371c7;
      }
LAB_00136f5f:
      switch(bVar10) {
      case 0xcc:
        uVar29 = (ulong)pbVar9[-1];
        goto LAB_00136f8e;
      case 0xcd:
        pbVar20 = pbVar9 + 1;
        uVar29 = (ulong)(ushort)(*(ushort *)(pbVar9 + -1) << 8 | *(ushort *)(pbVar9 + -1) >> 8);
        goto LAB_00136fcc;
      case 0xce:
        uVar19 = *(uint *)(pbVar9 + -1);
        uVar29 = (ulong)(uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                        uVar19 << 0x18);
        pbVar20 = local_22f + lVar5 + -4;
        goto LAB_00136fcc;
      case 0xcf:
        uVar16 = *(ulong *)(pbVar9 + -1);
        uVar29 = uVar16 >> 0x38 | (uVar16 & 0xff000000000000) >> 0x28 |
                 (uVar16 & 0xff0000000000) >> 0x18 | (uVar16 & 0xff00000000) >> 8 |
                 (uVar16 & 0xff000000) << 8 | (uVar16 & 0xff0000) << 0x18 |
                 (uVar16 & 0xff00) << 0x28 | uVar16 << 0x38;
        pbVar20 = local_22f + lVar5;
LAB_00136fcc:
        if (uVar29 < 0x8000) break;
LAB_00136eca:
        uVar29 = 0;
        iVar3 = 1;
        iVar2 = 0;
        pbVar20 = (byte *)pcVar40;
        goto LAB_00137017;
      case 0xd0:
        uVar29 = (ulong)(uint)(int)(char)pbVar9[-1];
LAB_00136f8e:
        pbVar20 = local_22f + lVar5 + -7;
        break;
      case 0xd1:
        uVar29 = (ulong)(ushort)(*(ushort *)(pbVar9 + -1) << 8 | *(ushort *)(pbVar9 + -1) >> 8);
        pbVar20 = local_22f + lVar5 + -6;
        break;
      case 0xd2:
        uVar19 = *(uint *)(pbVar9 + -1);
        pbVar20 = pbVar9 + 3;
        uVar29 = (ulong)(int)(uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                             uVar19 << 0x18);
        goto LAB_00136ff7;
      case 0xd3:
        uVar16 = *(ulong *)(pbVar9 + -1);
        uVar29 = uVar16 >> 0x38 | (uVar16 & 0xff000000000000) >> 0x28 |
                 (uVar16 & 0xff0000000000) >> 0x18 | (uVar16 & 0xff00000000) >> 8 |
                 (uVar16 & 0xff000000) << 8 | (uVar16 & 0xff0000) << 0x18 |
                 (uVar16 & 0xff00) << 0x28 | uVar16 << 0x38;
        pbVar20 = local_22f + lVar5;
LAB_00136ff7:
        if ((long)(short)uVar29 == uVar29) break;
        goto LAB_00136eca;
      default:
        if ((char)bVar10 < -0x20) goto LAB_00136eca;
        pbVar20 = local_22f + lVar5 + -8;
      }
      iVar2 = 1;
      iVar3 = 0;
LAB_00137017:
      if ((char)local_254 == '\0') {
        pcVar15 = 
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
        pcStack_270 = (code *)0x1370db;
        _ok(iVar3,"rc == -1",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x737,"check failure for code 0x%02X",(ulong)(uint)(int)(char)bVar10);
        pacVar11 = (char (*) [16])(ulong)((byte *)pcVar40 == pbVar20);
        pcStack_270 = (code *)0x137101;
        _ok((uint)((byte *)pcVar40 == pbVar20),"mp_num_pos2 == mp_nums[i]",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x738,"check position");
      }
      else {
        pcVar40 = 
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
        pcStack_270 = (code *)0x13705a;
        local_248 = uVar37;
        _ok(iVar2,"rc == 0",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x73b,"check success for code 0x%02X",(ulong)(uint)(int)(char)bVar10);
        uVar19 = (uint)(pbVar35 == pbVar20);
        pcStack_270 = (code *)0x137080;
        _ok((uint)(pbVar35 == pbVar20),"mp_num_pos1 == mp_num_pos2",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x73c,"check position");
        sVar34 = (short)uVar29;
        pcVar15 = (char *)pbVar41;
        if ((int)local_25c < 0) {
          uVar37 = uVar29;
          if (-1 < sVar34) {
LAB_001371c7:
            pcStack_270 = test_read_num<int,int,int(*)(char_const**,int*)>;
            test_read_num<short,int,int(*)(char_const**,short*)>();
            builtin_strncpy(acStack_3a0,"typed read of ",0xf);
            uVar16 = (ulong)(int)uVar19;
            if ((int)uVar19 < 0) {
              pcVar17 = "%lld";
              uVar29 = uVar16;
            }
            else {
              pcVar17 = "%llu";
              uVar29 = (ulong)uVar19;
            }
            pcStack_4c8 = (code *)0x137249;
            uStack_4c0 = uVar19;
            pbStack_298 = pbVar20;
            pbStack_290 = (byte *)pcVar15;
            uStack_288 = uVar37;
            pbStack_280 = pbVar9;
            pbStack_278 = pbVar35;
            pcStack_270 = (code *)pcVar40;
            iVar2 = snprintf(acStack_3a0 + 0xe,0xf2,pcVar17,uVar29);
            pcVar15 = acStack_3a0 + 0xe + iVar2;
            iVar3 = 0;
            pcStack_4c8 = (code *)0x137267;
            iVar2 = snprintf(pcVar15,(size_t)(auStack_2a0 + -(long)pcVar15)," into ");
            pcStack_4c8 = (code *)0x137286;
            snprintf(pcVar15 + iVar2,(size_t)(auStack_2a0 + -(long)(pcVar15 + iVar2)),"int%zu_t",
                     0x20);
            pcStack_4c8 = (code *)0x137295;
            _space((FILE *)_stdout);
            pcStack_4c8 = (code *)0x1372ae;
            fwrite("# ",2,1,_stdout);
            pcStack_4c8 = (code *)0x1372be;
            fputs(acStack_3a0,_stdout);
            pcStack_4c8 = (code *)0x1372cb;
            fputc(10,_stdout);
            uVar27 = uStack_4c0;
            if (-1 < (int)uStack_4c0) {
              pcStack_4c8 = (code *)0x1372e1;
              iVar3 = test_encode_uint_all_sizes((char (*) [16])&bStack_4a0,(ulong)uVar19);
            }
            pacVar11 = (char (*) [16])(&bStack_4a0 + (long)iVar3 * 0x10);
            pcStack_4c8 = (code *)0x137302;
            uStack_4b8 = uVar16;
            iVar2 = test_encode_int_all_sizes(pacVar11,uVar16);
            uVar19 = iVar3 + iVar2;
            if (uVar19 == 0 || SCARRY4(iVar3,iVar2) != (int)uVar19 < 0) {
              return;
            }
            fStack_4bc = (float)(int)uVar27;
            dStack_4a8 = (double)(int)uVar27;
            uStack_4b0 = (ulong)uVar19;
            puVar24 = (undefined1 *)((long)&uStack_49f + 1);
            lVar5 = 0;
            uVar37 = (ulong)uVar19;
            goto LAB_0013732e;
          }
          uVar19 = (uint)sVar34;
          pcVar40 = "(int64_t)num1 == (int64_t)num2";
          iVar2 = 0x746;
        }
        else {
          if (sVar34 < 0) {
LAB_00137170:
            pcStack_270 = (code *)0x137175;
            test_read_num<short,int,int(*)(char_const**,short*)>();
LAB_00137175:
            pcStack_270 = (code *)0x137194;
            __assert_fail("c == 0xcb",
                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                          ,0x987,"double mp_decode_double(const char **)");
          }
          uVar19 = (uint)uVar29 & 0xffff;
          pcVar40 = "(uint64_t)num1 == (uint64_t)num2";
          iVar2 = 0x743;
        }
        pacVar11 = (char (*) [16])(ulong)(uVar19 == local_25c);
        pcStack_270 = (code *)0x13713f;
        _ok((uint)(uVar19 == local_25c),pcVar40,
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            iVar2,"check int number");
        uVar37 = local_248;
      }
      uVar37 = uVar37 + 1;
      pbVar9 = pbVar9 + 0x10;
      pbVar41 = pbVar41 + -1;
    } while (pbVar41 != (byte *)0x0);
  }
  return;
LAB_0013732e:
  lVar6 = lVar5 * 0x10;
  bVar10 = puVar24[-2];
  uVar16 = (ulong)bVar10;
  uVar29 = (ulong)(uint)(int)(char)bVar10;
  mVar1 = mp_type_hint[uVar16];
  puVar12 = puVar24;
  if (mVar1 != MP_UINT) {
    if (mVar1 == MP_FLOAT) {
      if (bVar10 != 0xca) goto LAB_00137660;
      uVar19 = *(uint *)(puVar24 + -1);
      fVar14 = (float)(uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                      uVar19 << 0x18);
      if ((fVar14 != fStack_4bc) || (NAN(fVar14) || NAN(fStack_4bc))) {
        pcStack_4c8 = (code *)0x137684;
        test_read_num<int,int,int(*)(char_const**,int*)>();
        goto LAB_00137684;
      }
      puVar12 = puVar24 + 3;
      goto LAB_0013742e;
    }
    if (mVar1 == MP_INT) {
      uVar16 = (ulong)(char)bVar10;
      iVar2 = bVar10 - 0xd0;
      puVar28 = &switchD_00137390::switchdataD_00140cfc;
      switch(iVar2) {
      case 0:
        uVar16 = (ulong)(char)puVar24[-1];
        break;
      case 1:
        uVar16 = (ulong)(short)(*(ushort *)(puVar24 + -1) << 8 | *(ushort *)(puVar24 + -1) >> 8);
        puVar12 = auStack_497 + lVar6 + -6;
        break;
      case 2:
        uVar19 = *(uint *)(puVar24 + -1);
        uVar16 = (ulong)(int)(uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                             uVar19 << 0x18);
        puVar12 = auStack_497 + lVar6 + -4;
        break;
      case 3:
        uVar16 = *(ulong *)(puVar24 + -1);
        uVar16 = uVar16 >> 0x38 | (uVar16 & 0xff000000000000) >> 0x28 |
                 (uVar16 & 0xff0000000000) >> 0x18 | (uVar16 & 0xff00000000) >> 8 |
                 (uVar16 & 0xff000000) << 8 | (uVar16 & 0xff0000) << 0x18 |
                 (uVar16 & 0xff00) << 0x28 | uVar16 << 0x38;
        puVar12 = auStack_497 + lVar6;
        break;
      default:
        if (bVar10 < 0xe0) {
          pcStack_4c8 = (code *)0x13764c;
          test_read_num<int,int,int(*)(char_const**,int*)>();
          goto LAB_0013764c;
        }
        puVar28 = (uint *)pacVar11;
        puVar12 = auStack_497 + lVar6 + -8;
      }
      if (uVar16 != uStack_4b8) {
        pcStack_4c8 = (code *)0x1376a8;
        test_read_num<int,int,int(*)(char_const**,int*)>();
        goto LAB_001376a8;
      }
      goto LAB_001374bc;
    }
    if (bVar10 != 0xcb) {
LAB_00137684:
      pcStack_4c8 = (code *)0x1376a3;
      __assert_fail("c == 0xcb",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x987,"double mp_decode_double(const char **)");
    }
    uVar37 = *(ulong *)(puVar24 + -1);
    dVar18 = (double)(uVar37 >> 0x38 | (uVar37 & 0xff000000000000) >> 0x28 |
                      (uVar37 & 0xff0000000000) >> 0x18 | (uVar37 & 0xff00000000) >> 8 |
                      (uVar37 & 0xff000000) << 8 | (uVar37 & 0xff0000) << 0x18 |
                      (uVar37 & 0xff00) << 0x28 | uVar37 << 0x38);
    if ((dVar18 == dStack_4a8) && (!NAN(dVar18) && !NAN(dStack_4a8))) {
      puVar12 = auStack_497 + lVar6;
      goto LAB_0013742e;
    }
    goto LAB_0013765b;
  }
  iVar2 = bVar10 - 0xcc;
  puVar28 = &switchD_001373ed::switchdataD_00140cec;
  switch(iVar2) {
  case 0:
    uVar16 = (ulong)(byte)puVar24[-1];
    break;
  case 1:
    uVar16 = (ulong)(ushort)(*(ushort *)(puVar24 + -1) << 8 | *(ushort *)(puVar24 + -1) >> 8);
    puVar12 = auStack_497 + lVar6 + -6;
    break;
  case 2:
    uVar19 = *(uint *)(puVar24 + -1);
    uVar16 = (ulong)(uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                    uVar19 << 0x18);
    puVar12 = auStack_497 + lVar6 + -4;
    break;
  case 3:
    uVar16 = *(ulong *)(puVar24 + -1);
    uVar16 = uVar16 >> 0x38 | (uVar16 & 0xff000000000000) >> 0x28 |
             (uVar16 & 0xff0000000000) >> 0x18 | (uVar16 & 0xff00000000) >> 8 |
             (uVar16 & 0xff000000) << 8 | (uVar16 & 0xff0000) << 0x18 | (uVar16 & 0xff00) << 0x28 |
             uVar16 << 0x38;
    puVar12 = auStack_497 + lVar6;
    break;
  default:
    if (-1 < (char)bVar10) {
      puVar28 = (uint *)pacVar11;
      puVar12 = auStack_497 + lVar6 + -8;
      break;
    }
LAB_0013764c:
    pcStack_4c8 = (code *)0x137651;
    test_read_num<int,int,int(*)(char_const**,int*)>();
    goto LAB_00137651;
  }
  if (uVar16 != uStack_4b8) {
LAB_001376a8:
    pcStack_4c8 = test_read_num<int,long,int(*)(char_const**,int*)>;
    test_read_num<int,int,int(*)(char_const**,int*)>();
    builtin_strncpy(acStack_5f8,"typed read of ",0xf);
    pcVar40 = "%lld";
    if (-1 < (long)puVar28) {
      pcVar40 = "%llu";
    }
    iVar3 = 0;
    pcStack_720 = (code *)0x13771d;
    iStack_70c = iVar2;
    uStack_4f0 = uVar37;
    pcStack_4e8 = pcVar15;
    puStack_4e0 = puVar24 + -2;
    lStack_4d8 = lVar5;
    puStack_4d0 = puVar12;
    pcStack_4c8 = (code *)puVar24;
    iVar2 = snprintf(acStack_5f8 + 0xe,0xf2,pcVar40,puVar28);
    pbVar9 = (byte *)(acStack_5f8 + (long)iVar2 + 0xe);
    pcStack_720 = (code *)0x137741;
    iVar2 = snprintf((char *)pbVar9,(size_t)(auStack_4f8 + -(long)pbVar9)," into ");
    pcStack_720 = (code *)0x137760;
    snprintf((char *)(pbVar9 + iVar2),(size_t)(auStack_4f8 + -(long)(pbVar9 + iVar2)),"int%zu_t",
             0x20);
    pcStack_720 = (code *)0x13776f;
    _space((FILE *)_stdout);
    pcStack_720 = (code *)0x137788;
    fwrite("# ",2,1,_stdout);
    pcStack_720 = (code *)0x137798;
    fputs(acStack_5f8,_stdout);
    pcStack_720 = (code *)0x1377a5;
    fputc(10,_stdout);
    pacStack_718 = (char (*) [16])puVar28;
    if (-1 < (long)puVar28) {
      pcStack_720 = (code *)0x1377bb;
      iVar3 = test_encode_uint_all_sizes((char (*) [16])&bStack_6f8,(uint64_t)puVar28);
    }
    pacVar11 = (char (*) [16])(&bStack_6f8 + (long)iVar3 * 0x10);
    pcStack_720 = (code *)0x1377d8;
    iVar2 = test_encode_int_all_sizes(pacVar11,(int64_t)pacStack_718);
    uVar19 = iVar3 + iVar2;
    if (uVar19 == 0 || SCARRY4(iVar3,iVar2) != (int)uVar19 < 0) {
      return;
    }
    fStack_710 = (float)(long)pacStack_718;
    dStack_700 = (double)(long)pacStack_718;
    pbVar35 = (byte *)(ulong)uVar19;
    pbVar41 = (byte *)((long)&uStack_6f7 + 1);
    uVar37 = 0;
    goto LAB_00137808;
  }
LAB_001374bc:
  switch(bVar10) {
  case 0xcc:
    uVar29 = (ulong)(byte)puVar24[-1];
    goto LAB_001374e9;
  case 0xcd:
    puVar7 = auStack_497 + lVar6 + -6;
    uVar29 = (ulong)(ushort)(*(ushort *)(puVar24 + -1) << 8 | *(ushort *)(puVar24 + -1) >> 8);
    break;
  case 0xce:
    uVar19 = *(uint *)(puVar24 + -1);
    uVar29 = (ulong)(uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                    uVar19 << 0x18);
    puVar7 = puVar24 + 3;
    goto LAB_00137505;
  case 0xcf:
    uVar37 = *(ulong *)(puVar24 + -1);
    uVar29 = uVar37 >> 0x38 | (uVar37 & 0xff000000000000) >> 0x28 |
             (uVar37 & 0xff0000000000) >> 0x18 | (uVar37 & 0xff00000000) >> 8 |
             (uVar37 & 0xff000000) << 8 | (uVar37 & 0xff0000) << 0x18 | (uVar37 & 0xff00) << 0x28 |
             uVar37 << 0x38;
    puVar7 = auStack_497 + lVar6;
LAB_00137505:
    if (uVar29 < 0x80000000) break;
LAB_0013742e:
    uVar29 = 0;
    iVar2 = 0;
    puVar7 = puVar24 + -2;
    goto LAB_0013755f;
  case 0xd0:
    uVar29 = (ulong)(uint)(int)(char)puVar24[-1];
LAB_001374e9:
    puVar7 = auStack_497 + lVar6 + -7;
    break;
  case 0xd1:
    puVar7 = auStack_497 + lVar6 + -6;
    uVar29 = (ulong)(uint)(int)(short)(*(ushort *)(puVar24 + -1) << 8 |
                                      *(ushort *)(puVar24 + -1) >> 8);
    break;
  case 0xd2:
    uVar19 = *(uint *)(puVar24 + -1);
    uVar29 = (ulong)(uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                    uVar19 << 0x18);
    puVar7 = auStack_497 + lVar6 + -4;
    break;
  case 0xd3:
    uVar37 = *(ulong *)(puVar24 + -1);
    uVar16 = uVar37 >> 0x38 | (uVar37 & 0xff000000000000) >> 0x28 |
             (uVar37 & 0xff0000000000) >> 0x18 | (uVar37 & 0xff00000000) >> 8;
    uVar29 = uVar16 | (uVar37 & 0xff000000) << 8 | (uVar37 & 0xff0000) << 0x18 |
             (uVar37 & 0xff00) << 0x28 | uVar37 << 0x38;
    if ((long)(int)uVar16 == uVar29) {
      puVar7 = auStack_497 + lVar6;
      break;
    }
    goto LAB_0013742e;
  default:
    if ((char)bVar10 < -0x20) goto LAB_0013742e;
    iVar2 = 1;
    puVar7 = auStack_497 + lVar6 + -8;
    goto LAB_0013755f;
  }
  iVar2 = 1;
LAB_0013755f:
  pcVar15 = "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
  pcStack_4c8 = (code *)0x137583;
  _ok(iVar2,"rc == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73b,
      "check success for code 0x%02X");
  pcStack_4c8 = (code *)0x1375a9;
  _ok((uint)(puVar12 == puVar7),"mp_num_pos1 == mp_num_pos2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73c,
      "check position");
  uVar19 = (uint)uVar29;
  if ((int)uStack_4c0 < 0) {
    if (-1 < (int)uVar19) goto LAB_00137656;
    pcVar40 = "(int64_t)num1 == (int64_t)num2";
    iVar2 = 0x746;
  }
  else {
    if ((int)uVar19 < 0) {
LAB_00137651:
      pcStack_4c8 = (code *)0x137656;
      test_read_num<int,int,int(*)(char_const**,int*)>();
LAB_00137656:
      pcStack_4c8 = (code *)0x13765b;
      test_read_num<int,int,int(*)(char_const**,int*)>();
LAB_0013765b:
      pcStack_4c8 = (code *)0x137660;
      test_read_num<int,int,int(*)(char_const**,int*)>();
LAB_00137660:
      pcStack_4c8 = (code *)0x13767f;
      __assert_fail("c == 0xca",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x97e,"float mp_decode_float(const char **)");
    }
    pcVar40 = "(uint64_t)num1 == (uint64_t)num2";
    iVar2 = 0x743;
  }
  pacVar11 = (char (*) [16])(ulong)(uVar19 == uStack_4c0);
  pcStack_4c8 = (code *)0x137602;
  _ok((uint)(uVar19 == uStack_4c0),pcVar40,
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",iVar2,
      "check int number");
  lVar5 = lVar5 + 1;
  puVar24 = puVar24 + 0x10;
  uStack_4b0 = uStack_4b0 - 1;
  uVar37 = uVar29;
  if (uStack_4b0 == 0) {
    return;
  }
  goto LAB_0013732e;
LAB_00137808:
  uVar19 = (uint)pacVar11;
  lVar5 = uVar37 * 0x10;
  pbVar21 = &bStack_6f8 + lVar5;
  pbVar20 = pbVar41 + -2;
  bVar10 = pbVar41[-2];
  pacVar11 = (char (*) [16])(ulong)bVar10;
  uVar16 = (ulong)(uint)(int)(char)bVar10;
  mVar1 = mp_type_hint[(long)pacVar11];
  pbVar26 = pbVar41;
  if (mVar1 != MP_UINT) {
    if (mVar1 == MP_FLOAT) {
      if (bVar10 != 0xca) {
LAB_00137bd8:
        pcStack_720 = (code *)0x137bf7;
        __assert_fail("c == 0xca",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x97e,"float mp_decode_float(const char **)");
      }
      uVar27 = *(uint *)(pbVar41 + -1);
      fVar14 = (float)(uVar27 >> 0x18 | (uVar27 & 0xff0000) >> 8 | (uVar27 & 0xff00) << 8 |
                      uVar27 << 0x18);
      if ((fVar14 == fStack_710) && (!NAN(fVar14) && !NAN(fStack_710))) {
        pbVar26 = pbVar41 + 3;
        goto LAB_0013790e;
      }
      pcStack_720 = (code *)0x137bfc;
      test_read_num<int,long,int(*)(char_const**,int*)>();
LAB_00137bfc:
      pcStack_720 = (code *)0x137c01;
      test_read_num<int,long,int(*)(char_const**,int*)>();
      goto LAB_00137c01;
    }
    if (mVar1 == MP_INT) {
      pacVar11 = (char (*) [16])(long)(char)bVar10;
      switch(bVar10) {
      case 0xd0:
        pacVar11 = (char (*) [16])(long)(char)pbVar41[-1];
        break;
      case 0xd1:
        pacVar11 = (char (*) [16])
                   (long)(short)(*(ushort *)(pbVar41 + -1) << 8 | *(ushort *)(pbVar41 + -1) >> 8);
        pbVar26 = abStack_6ef + lVar5 + -6;
        break;
      case 0xd2:
        uVar27 = *(uint *)(pbVar41 + -1);
        pacVar11 = (char (*) [16])
                   (long)(int)(uVar27 >> 0x18 | (uVar27 & 0xff0000) >> 8 | (uVar27 & 0xff00) << 8 |
                              uVar27 << 0x18);
        pbVar26 = abStack_6ef + lVar5 + -4;
        break;
      case 0xd3:
        uVar29 = *(ulong *)(pbVar41 + -1);
        pacVar11 = (char (*) [16])
                   (uVar29 >> 0x38 | (uVar29 & 0xff000000000000) >> 0x28 |
                    (uVar29 & 0xff0000000000) >> 0x18 | (uVar29 & 0xff00000000) >> 8 |
                    (uVar29 & 0xff000000) << 8 | (uVar29 & 0xff0000) << 0x18 |
                    (uVar29 & 0xff00) << 0x28 | uVar29 << 0x38);
        pbVar26 = abStack_6ef + lVar5;
        break;
      default:
        if (bVar10 < 0xe0) {
          pcStack_720 = (code *)0x137baa;
          test_read_num<int,long,int(*)(char_const**,int*)>();
          goto LAB_00137baa;
        }
        pbVar26 = abStack_6ef + lVar5 + -8;
      }
      if (pacVar11 != pacStack_718) goto LAB_00137bfc;
      goto LAB_0013799d;
    }
    if (bVar10 != 0xcb) goto LAB_00137bb4;
    uVar16 = *(ulong *)(pbVar41 + -1);
    dVar18 = (double)(uVar16 >> 0x38 | (uVar16 & 0xff000000000000) >> 0x28 |
                      (uVar16 & 0xff0000000000) >> 0x18 | (uVar16 & 0xff00000000) >> 8 |
                      (uVar16 & 0xff000000) << 8 | (uVar16 & 0xff0000) << 0x18 |
                      (uVar16 & 0xff00) << 0x28 | uVar16 << 0x38);
    if ((dVar18 != dStack_700) || (NAN(dVar18) || NAN(dStack_700))) {
      pcStack_720 = (code *)0x137bd8;
      test_read_num<int,long,int(*)(char_const**,int*)>();
      goto LAB_00137bd8;
    }
    pbVar26 = abStack_6ef + lVar5;
    goto LAB_0013790e;
  }
  switch(bVar10) {
  case 0xcc:
    pacVar11 = (char (*) [16])(ulong)pbVar41[-1];
    break;
  case 0xcd:
    pacVar11 = (char (*) [16])
               (ulong)(ushort)(*(ushort *)(pbVar41 + -1) << 8 | *(ushort *)(pbVar41 + -1) >> 8);
    pbVar26 = abStack_6ef + lVar5 + -6;
    break;
  case 0xce:
    uVar27 = *(uint *)(pbVar41 + -1);
    pacVar11 = (char (*) [16])
               (ulong)(uVar27 >> 0x18 | (uVar27 & 0xff0000) >> 8 | (uVar27 & 0xff00) << 8 |
                      uVar27 << 0x18);
    pbVar26 = abStack_6ef + lVar5 + -4;
    break;
  case 0xcf:
    uVar29 = *(ulong *)(pbVar41 + -1);
    pacVar11 = (char (*) [16])
               (uVar29 >> 0x38 | (uVar29 & 0xff000000000000) >> 0x28 |
                (uVar29 & 0xff0000000000) >> 0x18 | (uVar29 & 0xff00000000) >> 8 |
                (uVar29 & 0xff000000) << 8 | (uVar29 & 0xff0000) << 0x18 | (uVar29 & 0xff00) << 0x28
               | uVar29 << 0x38);
    pbVar26 = abStack_6ef + lVar5;
    break;
  default:
    if (-1 < (char)bVar10) {
      pbVar26 = abStack_6ef + lVar5 + -8;
      break;
    }
LAB_00137baa:
    pcStack_720 = (code *)0x137baf;
    test_read_num<int,long,int(*)(char_const**,int*)>();
    goto LAB_00137baf;
  }
  if (pacVar11 != pacStack_718) {
LAB_00137c01:
    pcStack_720 = (code *)0x137c06;
    test_read_num<int,long,int(*)(char_const**,int*)>();
    pbVar26 = pbVar35;
    pcVar15 = (char *)puVar28;
    goto LAB_00137c06;
  }
LAB_0013799d:
  switch(bVar10) {
  case 0xcc:
    uVar16 = (ulong)pbVar41[-1];
    goto LAB_001379ca;
  case 0xcd:
    pbVar21 = abStack_6ef + lVar5 + -6;
    uVar16 = (ulong)(ushort)(*(ushort *)(pbVar41 + -1) << 8 | *(ushort *)(pbVar41 + -1) >> 8);
    break;
  case 0xce:
    uVar19 = *(uint *)(pbVar41 + -1);
    uVar16 = (ulong)(uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                    uVar19 << 0x18);
    pbVar21 = pbVar41 + 3;
    goto LAB_001379e6;
  case 0xcf:
    uVar16 = *(ulong *)(pbVar41 + -1);
    uVar16 = uVar16 >> 0x38 | (uVar16 & 0xff000000000000) >> 0x28 |
             (uVar16 & 0xff0000000000) >> 0x18 | (uVar16 & 0xff00000000) >> 8 |
             (uVar16 & 0xff000000) << 8 | (uVar16 & 0xff0000) << 0x18 | (uVar16 & 0xff00) << 0x28 |
             uVar16 << 0x38;
    pbVar21 = abStack_6ef + lVar5;
LAB_001379e6:
    if (uVar16 < 0x80000000) break;
LAB_0013790e:
    uVar16 = 0;
    iVar3 = 1;
    iVar2 = 0;
    pbVar21 = pbVar20;
    goto LAB_00137a3f;
  case 0xd0:
    uVar16 = (ulong)(uint)(int)(char)pbVar41[-1];
LAB_001379ca:
    pbVar21 = abStack_6ef + lVar5 + -7;
    break;
  case 0xd1:
    pbVar21 = abStack_6ef + lVar5 + -6;
    uVar16 = (ulong)(uint)(int)(short)(*(ushort *)(pbVar41 + -1) << 8 |
                                      *(ushort *)(pbVar41 + -1) >> 8);
    break;
  case 0xd2:
    uVar19 = *(uint *)(pbVar41 + -1);
    uVar16 = (ulong)(uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                    uVar19 << 0x18);
    pbVar21 = abStack_6ef + lVar5 + -4;
    break;
  case 0xd3:
    uVar16 = *(ulong *)(pbVar41 + -1);
    uVar29 = uVar16 >> 0x38 | (uVar16 & 0xff000000000000) >> 0x28 |
             (uVar16 & 0xff0000000000) >> 0x18 | (uVar16 & 0xff00000000) >> 8;
    uVar16 = uVar29 | (uVar16 & 0xff000000) << 8 | (uVar16 & 0xff0000) << 0x18 |
             (uVar16 & 0xff00) << 0x28 | uVar16 << 0x38;
    if ((long)(int)uVar29 == uVar16) {
      pbVar21 = abStack_6ef + lVar5;
      break;
    }
    goto LAB_0013790e;
  default:
    if ((char)bVar10 < -0x20) goto LAB_0013790e;
    iVar2 = 1;
    iVar3 = 0;
    pbVar21 = abStack_6ef + lVar5 + -8;
    goto LAB_00137a3f;
  }
  iVar2 = 1;
  iVar3 = 0;
LAB_00137a3f:
  if ((char)iStack_70c == '\0') {
    pcStack_720 = (code *)0x137b01;
    _ok(iVar3,"rc == -1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x737,"check failure for code 0x%02X");
    pacVar11 = (char (*) [16])(ulong)(pbVar20 == pbVar21);
    pcStack_720 = (code *)0x137b27;
    _ok((uint)(pbVar20 == pbVar21),"mp_num_pos2 == mp_nums[i]",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x738,"check position");
  }
  else {
    pcVar15 = 
    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
    pcStack_720 = (code *)0x137a7e;
    uStack_708 = uVar37;
    _ok(iVar2,"rc == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73b,"check success for code 0x%02X");
    uVar19 = (uint)(pbVar26 == pbVar21);
    pcStack_720 = (code *)0x137aa4;
    _ok((uint)(pbVar26 == pbVar21),"mp_num_pos1 == mp_num_pos2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73c,"check position");
    iVar2 = (int)uVar16;
    if ((long)pacStack_718 < 0) {
      pbVar9 = pbVar35;
      uVar37 = uVar16;
      if (-1 < iVar2) {
LAB_00137c06:
        pcStack_720 = test_read_num<long,int,int(*)(char_const**,long*)>;
        test_read_num<int,long,int(*)(char_const**,int*)>();
        builtin_strncpy(acStack_850,"typed read of ",0xf);
        uVar16 = (ulong)(int)uVar19;
        if ((int)uVar19 < 0) {
          pcVar40 = "%lld";
          uVar29 = uVar16;
        }
        else {
          pcVar40 = "%llu";
          uVar29 = (ulong)uVar19;
        }
        pcStack_988 = (code *)0x137c8b;
        uStack_974 = uVar19;
        pbStack_748 = pbVar21;
        pbStack_740 = pbVar9;
        pbStack_738 = pbVar26;
        pacStack_730 = (char (*) [16])pcVar15;
        uStack_728 = uVar37;
        pcStack_720 = (code *)pbVar41;
        iVar2 = snprintf(acStack_850 + 0xe,0xf2,pcVar40,uVar29);
        pcVar40 = acStack_850 + 0xe + iVar2;
        iVar3 = 0;
        pcStack_988 = (code *)0x137ca9;
        iVar2 = snprintf(pcVar40,(size_t)(acStack_750 + -(long)pcVar40)," into ");
        pcVar15 = acStack_750 + -(long)(pcVar40 + iVar2);
        pcStack_988 = (code *)0x137cc8;
        snprintf(pcVar40 + iVar2,(size_t)pcVar15,"int%zu_t",0x40);
        pcStack_988 = (code *)0x137cd7;
        _space((FILE *)_stdout);
        pcStack_988 = (code *)0x137cf0;
        fwrite("# ",2,1,_stdout);
        pcStack_988 = (code *)0x137d00;
        fputs(acStack_850,_stdout);
        pcStack_988 = (code *)0x137d0d;
        fputc(10,_stdout);
        if (-1 < (int)uStack_974) {
          pcStack_988 = (code *)0x137d21;
          iVar3 = test_encode_uint_all_sizes((char (*) [16])&bStack_950,(ulong)uVar19);
        }
        pacVar11 = (char (*) [16])(&bStack_950 + (long)iVar3 * 0x10);
        pcStack_988 = (code *)0x137d3d;
        iVar2 = test_encode_int_all_sizes(pacVar11,uVar16);
        uVar19 = iVar3 + iVar2;
        if (uVar19 == 0 || SCARRY4(iVar3,iVar2) != (int)uVar19 < 0) {
          return;
        }
        fStack_964 = (float)(int)uStack_974;
        dStack_958 = (double)(int)uStack_974;
        uStack_960 = (ulong)uVar19;
        puVar24 = (undefined1 *)((long)&uStack_94f + 1);
        lVar5 = 0;
        uStack_970 = uVar16;
        goto LAB_00137d70;
      }
      pacVar8 = (char (*) [16])(long)iVar2;
      pcVar15 = "(int64_t)num1 == (int64_t)num2";
      iVar2 = 0x746;
    }
    else {
      if (iVar2 < 0) {
LAB_00137baf:
        pcStack_720 = (code *)0x137bb4;
        test_read_num<int,long,int(*)(char_const**,int*)>();
LAB_00137bb4:
        pcStack_720 = (code *)0x137bd3;
        __assert_fail("c == 0xcb",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x987,"double mp_decode_double(const char **)");
      }
      pacVar8 = (char (*) [16])(uVar16 & 0xffffffff);
      pcVar15 = "(uint64_t)num1 == (uint64_t)num2";
      iVar2 = 0x743;
    }
    pacVar11 = (char (*) [16])(ulong)(pacVar8 == pacStack_718);
    pcStack_720 = (code *)0x137b62;
    _ok((uint)(pacVar8 == pacStack_718),pcVar15,
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        iVar2,"check int number");
    pbVar20 = pbVar35;
    uVar37 = uStack_708;
  }
  uVar37 = uVar37 + 1;
  pbVar41 = pbVar41 + 0x10;
  pbVar35 = pbVar35 + -1;
  pbVar9 = pbVar20;
  puVar28 = (uint *)
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
  if (pbVar35 == (byte *)0x0) {
    return;
  }
  goto LAB_00137808;
LAB_00137d70:
  lVar6 = lVar5 * 0x10;
  puVar12 = puVar24 + -2;
  bVar10 = puVar24[-2];
  uVar37 = (ulong)bVar10;
  uVar16 = (ulong)(char)bVar10;
  mVar1 = mp_type_hint[uVar37];
  puVar7 = puVar24;
  if (mVar1 != MP_UINT) {
    if (mVar1 == MP_FLOAT) {
      if (bVar10 != 0xca) goto LAB_0013809f;
      uVar19 = *(uint *)(puVar24 + -1);
      fVar14 = (float)(uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                      uVar19 << 0x18);
      if ((fVar14 != fStack_964) || (NAN(fVar14) || NAN(fStack_964))) {
        pcStack_988 = (code *)0x1380c3;
        test_read_num<long,int,int(*)(char_const**,long*)>();
        goto LAB_001380c3;
      }
      puVar7 = puVar24 + 3;
      goto LAB_00137e70;
    }
    if (mVar1 == MP_INT) {
      iVar2 = bVar10 - 0xd0;
      puVar28 = &switchD_00137dd0::switchdataD_00140d7c;
      switch(iVar2) {
      case 0:
        uVar37 = (ulong)(char)puVar24[-1];
        break;
      case 1:
        uVar37 = (ulong)(short)(*(ushort *)(puVar24 + -1) << 8 | *(ushort *)(puVar24 + -1) >> 8);
        puVar7 = auStack_947 + lVar6 + -6;
        break;
      case 2:
        uVar19 = *(uint *)(puVar24 + -1);
        uVar37 = (ulong)(int)(uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                             uVar19 << 0x18);
        puVar7 = auStack_947 + lVar6 + -4;
        break;
      case 3:
        uVar37 = *(ulong *)(puVar24 + -1);
        uVar37 = uVar37 >> 0x38 | (uVar37 & 0xff000000000000) >> 0x28 |
                 (uVar37 & 0xff0000000000) >> 0x18 | (uVar37 & 0xff00000000) >> 8 |
                 (uVar37 & 0xff000000) << 8 | (uVar37 & 0xff0000) << 0x18 |
                 (uVar37 & 0xff00) << 0x28 | uVar37 << 0x38;
        puVar7 = auStack_947 + lVar6;
        break;
      default:
        if (bVar10 < 0xe0) {
          pcStack_988 = (code *)0x13808b;
          test_read_num<long,int,int(*)(char_const**,long*)>();
          goto LAB_0013808b;
        }
        uVar37 = uVar16;
        puVar28 = (uint *)pacVar11;
        puVar7 = auStack_947 + lVar6 + -8;
      }
      if (uVar37 != uStack_970) {
        pcStack_988 = (code *)0x1380e7;
        test_read_num<long,int,int(*)(char_const**,long*)>();
        goto LAB_001380e7;
      }
      goto LAB_00137f04;
    }
    if (bVar10 != 0xcb) {
LAB_001380c3:
      pcStack_988 = (code *)0x1380e2;
      __assert_fail("c == 0xcb",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x987,"double mp_decode_double(const char **)");
    }
    uVar37 = *(ulong *)(puVar24 + -1);
    dVar18 = (double)(uVar37 >> 0x38 | (uVar37 & 0xff000000000000) >> 0x28 |
                      (uVar37 & 0xff0000000000) >> 0x18 | (uVar37 & 0xff00000000) >> 8 |
                      (uVar37 & 0xff000000) << 8 | (uVar37 & 0xff0000) << 0x18 |
                      (uVar37 & 0xff00) << 0x28 | uVar37 << 0x38);
    if ((dVar18 == dStack_958) && (!NAN(dVar18) && !NAN(dStack_958))) {
      puVar7 = auStack_947 + lVar6;
      goto LAB_00137e70;
    }
    goto LAB_0013809a;
  }
  iVar2 = bVar10 - 0xcc;
  puVar28 = &switchD_00137e2e::switchdataD_00140d6c;
  switch(iVar2) {
  case 0:
    uVar37 = (ulong)(byte)puVar24[-1];
    break;
  case 1:
    uVar37 = (ulong)(ushort)(*(ushort *)(puVar24 + -1) << 8 | *(ushort *)(puVar24 + -1) >> 8);
    puVar7 = auStack_947 + lVar6 + -6;
    break;
  case 2:
    uVar19 = *(uint *)(puVar24 + -1);
    uVar37 = (ulong)(uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                    uVar19 << 0x18);
    puVar7 = auStack_947 + lVar6 + -4;
    break;
  case 3:
    uVar37 = *(ulong *)(puVar24 + -1);
    uVar37 = uVar37 >> 0x38 | (uVar37 & 0xff000000000000) >> 0x28 |
             (uVar37 & 0xff0000000000) >> 0x18 | (uVar37 & 0xff00000000) >> 8 |
             (uVar37 & 0xff000000) << 8 | (uVar37 & 0xff0000) << 0x18 | (uVar37 & 0xff00) << 0x28 |
             uVar37 << 0x38;
    puVar7 = auStack_947 + lVar6;
    break;
  default:
    if (-1 < (char)bVar10) {
      puVar28 = (uint *)pacVar11;
      puVar7 = auStack_947 + lVar6 + -8;
      break;
    }
LAB_0013808b:
    pcStack_988 = (code *)0x138090;
    test_read_num<long,int,int(*)(char_const**,long*)>();
    goto LAB_00138090;
  }
  if (uVar37 != uStack_970) {
LAB_001380e7:
    pcStack_988 = test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>;
    test_read_num<long,int,int(*)(char_const**,long*)>();
    builtin_strncpy(acStack_ab8,"typed read of ",0xf);
    pcStack_bf0 = (code *)0x138151;
    pacStack_bd8 = (char (*) [16])puVar28;
    iStack_bcc = iVar2;
    uStack_9b0 = uVar16;
    pcStack_9a8 = pcVar15;
    lStack_9a0 = lVar5;
    puStack_998 = puVar7;
    puStack_990 = puVar24;
    pcStack_988 = (code *)puVar12;
    iVar2 = snprintf(acStack_ab8 + 0xe,0xf2,"%llu",puVar28);
    pcVar15 = acStack_ab8 + (long)iVar2 + 0xe;
    pcStack_bf0 = (code *)0x138175;
    iVar2 = snprintf(pcVar15,(size_t)(auStack_9b8 + -(long)pcVar15)," into ");
    pcStack_bf0 = (code *)0x138194;
    snprintf(pcVar15 + iVar2,(size_t)(auStack_9b8 + -(long)(pcVar15 + iVar2)),"int%zu_t",0x40);
    pcStack_bf0 = (code *)0x1381a3;
    _space((FILE *)_stdout);
    pcStack_bf0 = (code *)0x1381bc;
    fwrite("# ",2,1,_stdout);
    pcStack_bf0 = (code *)0x1381cc;
    fputs(acStack_ab8,_stdout);
    pcStack_bf0 = (code *)0x1381d9;
    fputc(10,_stdout);
    pacVar11 = (char (*) [16])&bStack_bb8;
    pcStack_bf0 = (code *)0x1381e6;
    pcVar40 = (char *)puVar28;
    uVar19 = test_encode_uint_all_sizes(pacVar11,(uint64_t)puVar28);
    if (-1 < (long)puVar28) {
      pacVar11 = (char (*) [16])(&bStack_bb8 + (long)(int)uVar19 * 0x10);
      pcVar40 = (char *)0x7fffffffffffffff;
      pcStack_bf0 = (code *)0x13820b;
      iVar2 = test_encode_int_all_sizes(pacVar11,0x7fffffffffffffff);
      uVar19 = uVar19 + iVar2;
    }
    if ((int)uVar19 < 1) {
      return;
    }
    fStack_bdc = (float)pacStack_bd8;
    auVar43._8_4_ = (int)((ulong)pacStack_bd8 >> 0x20);
    auVar43._0_8_ = pacStack_bd8;
    auVar43._12_4_ = 0x45300000;
    dStack_bc0 = auVar43._8_8_ - 1.9342813113834067e+25;
    dStack_bc8 = dStack_bc0 + ((double)CONCAT44(0x43300000,(int)pacStack_bd8) - 4503599627370496.0);
    pcVar22 = (char *)(ulong)uVar19;
    pcVar17 = (char *)((long)&uStack_bb7 + 1);
    lVar5 = 0;
    goto LAB_00138274;
  }
LAB_00137f04:
  switch(bVar10) {
  case 0xcc:
    uVar16 = (ulong)(byte)puVar24[-1];
    goto LAB_00137f32;
  case 0xcd:
    puVar12 = auStack_947 + lVar6 + -6;
    uVar16 = (ulong)(ushort)(*(ushort *)(puVar24 + -1) << 8 | *(ushort *)(puVar24 + -1) >> 8);
    break;
  case 0xce:
    uVar19 = *(uint *)(puVar24 + -1);
    uVar16 = (ulong)(uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                    uVar19 << 0x18);
    puVar12 = auStack_947 + lVar6 + -4;
    break;
  case 0xcf:
    uVar37 = *(ulong *)(puVar24 + -1);
    uVar16 = uVar37 >> 0x38 | (uVar37 & 0xff000000000000) >> 0x28 |
             (uVar37 & 0xff0000000000) >> 0x18 | (uVar37 & 0xff00000000) >> 8 |
             (uVar37 & 0xff000000) << 8 | (uVar37 & 0xff0000) << 0x18 | (uVar37 & 0xff00) << 0x28 |
             uVar37 << 0x38;
    if (-1 < (long)uVar16) goto LAB_00137f5c;
LAB_00137e70:
    uVar16 = 0;
    iVar2 = 0;
    goto LAB_00137faa;
  case 0xd0:
    uVar16 = (ulong)(char)puVar24[-1];
LAB_00137f32:
    puVar12 = auStack_947 + lVar6 + -7;
    break;
  case 0xd1:
    puVar12 = auStack_947 + lVar6 + -6;
    uVar16 = (ulong)(short)(*(ushort *)(puVar24 + -1) << 8 | *(ushort *)(puVar24 + -1) >> 8);
    break;
  case 0xd2:
    uVar19 = *(uint *)(puVar24 + -1);
    puVar12 = auStack_947 + lVar6 + -4;
    uVar16 = (ulong)(int)(uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                         uVar19 << 0x18);
    break;
  case 0xd3:
    uVar37 = *(ulong *)(puVar24 + -1);
    uVar16 = uVar37 >> 0x38 | (uVar37 & 0xff000000000000) >> 0x28 |
             (uVar37 & 0xff0000000000) >> 0x18 | (uVar37 & 0xff00000000) >> 8 |
             (uVar37 & 0xff000000) << 8 | (uVar37 & 0xff0000) << 0x18 | (uVar37 & 0xff00) << 0x28 |
             uVar37 << 0x38;
LAB_00137f5c:
    puVar12 = auStack_947 + lVar6;
    break;
  default:
    if ((char)bVar10 < -0x20) goto LAB_00137e70;
    puVar12 = auStack_947 + lVar6 + -8;
  }
  iVar2 = 1;
LAB_00137faa:
  pcVar15 = "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
  pcStack_988 = (code *)0x137fd2;
  _ok(iVar2,"rc == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73b,
      "check success for code 0x%02X",(ulong)(uint)(int)(char)bVar10);
  pcStack_988 = (code *)0x137ff8;
  _ok((uint)(puVar7 == puVar12),"mp_num_pos1 == mp_num_pos2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73c,
      "check position");
  if ((int)uStack_974 < 0) {
    if (-1 < (long)uVar16) goto LAB_00138095;
    pcVar40 = "(int64_t)num1 == (int64_t)num2";
    iVar2 = 0x746;
  }
  else {
    if ((long)uVar16 < 0) {
LAB_00138090:
      pcStack_988 = (code *)0x138095;
      test_read_num<long,int,int(*)(char_const**,long*)>();
LAB_00138095:
      pcStack_988 = (code *)0x13809a;
      test_read_num<long,int,int(*)(char_const**,long*)>();
LAB_0013809a:
      pcStack_988 = (code *)0x13809f;
      test_read_num<long,int,int(*)(char_const**,long*)>();
LAB_0013809f:
      pcStack_988 = (code *)0x1380be;
      __assert_fail("c == 0xca",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x97e,"float mp_decode_float(const char **)");
    }
    pcVar40 = "(uint64_t)num1 == (uint64_t)num2";
    iVar2 = 0x743;
  }
  pacVar11 = (char (*) [16])(ulong)(uVar16 == uStack_970);
  pcStack_988 = (code *)0x13805f;
  _ok((uint)(uVar16 == uStack_970),pcVar40,
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",iVar2,
      "check int number");
  lVar5 = lVar5 + 1;
  puVar24 = puVar24 + 0x10;
  uStack_960 = uStack_960 - 1;
  if (uStack_960 == 0) {
    return;
  }
  goto LAB_00137d70;
LAB_00138274:
  lVar6 = lVar5 * 0x10;
  pcVar32 = pcVar17 + -2;
  bVar10 = pcVar17[-2];
  pacVar8 = (char (*) [16])(ulong)bVar10;
  pacVar30 = (char (*) [16])(long)(char)bVar10;
  mVar1 = mp_type_hint[(long)pacVar8];
  if (mVar1 != MP_UINT) {
    if (mVar1 == MP_FLOAT) {
      if (bVar10 != 0xca) {
LAB_001385f4:
        pcStack_bf0 = (code *)0x138613;
        __assert_fail("c == 0xca",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x97e,"float mp_decode_float(const char **)");
      }
      uVar19 = *(uint *)(pcVar17 + -1);
      fVar14 = (float)(uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                      uVar19 << 0x18);
      if ((fVar14 == fStack_bdc) && (!NAN(fVar14) && !NAN(fStack_bdc))) {
        pcVar15 = pcVar17 + 3;
        goto LAB_0013837a;
      }
      pcStack_bf0 = (code *)0x138618;
      test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
LAB_00138618:
      pcStack_bf0 = (code *)0x13861d;
      test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
      goto LAB_0013861d;
    }
    if (mVar1 == MP_INT) {
      switch(bVar10) {
      case 0xd0:
        pacVar8 = (char (*) [16])(long)pcVar17[-1];
        pcVar40 = (char *)&switchD_001382d0::switchdataD_00140dbc;
        pcVar15 = pcVar17;
        break;
      case 0xd1:
        pacVar8 = (char (*) [16])
                  (long)(short)(*(ushort *)(pcVar17 + -1) << 8 | *(ushort *)(pcVar17 + -1) >> 8);
        pcVar40 = (char *)&switchD_001382d0::switchdataD_00140dbc;
        pcVar15 = acStack_baf + lVar6 + -6;
        break;
      case 0xd2:
        uVar19 = *(uint *)(pcVar17 + -1);
        pacVar8 = (char (*) [16])
                  (long)(int)(uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                             uVar19 << 0x18);
        pcVar40 = (char *)&switchD_001382d0::switchdataD_00140dbc;
        pcVar15 = acStack_baf + lVar6 + -4;
        break;
      case 0xd3:
        uVar37 = *(ulong *)(pcVar17 + -1);
        pacVar8 = (char (*) [16])
                  (uVar37 >> 0x38 | (uVar37 & 0xff000000000000) >> 0x28 |
                   (uVar37 & 0xff0000000000) >> 0x18 | (uVar37 & 0xff00000000) >> 8 |
                   (uVar37 & 0xff000000) << 8 | (uVar37 & 0xff0000) << 0x18 |
                   (uVar37 & 0xff00) << 0x28 | uVar37 << 0x38);
        pcVar40 = (char *)&switchD_001382d0::switchdataD_00140dbc;
        pcVar15 = acStack_baf + lVar6;
        break;
      default:
        if (bVar10 < 0xe0) {
          pcStack_bf0 = (code *)0x1385c6;
          test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
          goto LAB_001385c6;
        }
        pacVar8 = pacVar30;
        pcVar15 = acStack_baf + lVar6 + -8;
      }
      if (pacVar8 != pacStack_bd8) goto LAB_00138618;
      goto LAB_0013840f;
    }
    if (bVar10 != 0xcb) goto LAB_001385d0;
    uVar37 = *(ulong *)(pcVar17 + -1);
    dVar18 = (double)(uVar37 >> 0x38 | (uVar37 & 0xff000000000000) >> 0x28 |
                      (uVar37 & 0xff0000000000) >> 0x18 | (uVar37 & 0xff00000000) >> 8 |
                      (uVar37 & 0xff000000) << 8 | (uVar37 & 0xff0000) << 0x18 |
                      (uVar37 & 0xff00) << 0x28 | uVar37 << 0x38);
    if ((dVar18 != dStack_bc8) || (NAN(dVar18) || NAN(dStack_bc8))) {
      pcStack_bf0 = (code *)0x1385f4;
      test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
      goto LAB_001385f4;
    }
    pcVar15 = acStack_baf + lVar6;
    goto LAB_0013837a;
  }
  switch(bVar10) {
  case 0xcc:
    pacVar8 = (char (*) [16])(ulong)(byte)pcVar17[-1];
    pcVar40 = (char *)&switchD_00138333::switchdataD_00140dac;
    pcVar15 = pcVar17;
    break;
  case 0xcd:
    pacVar8 = (char (*) [16])
              (ulong)(ushort)(*(ushort *)(pcVar17 + -1) << 8 | *(ushort *)(pcVar17 + -1) >> 8);
    pcVar40 = (char *)&switchD_00138333::switchdataD_00140dac;
    pcVar15 = acStack_baf + lVar6 + -6;
    break;
  case 0xce:
    uVar19 = *(uint *)(pcVar17 + -1);
    pacVar8 = (char (*) [16])
              (ulong)(uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                     uVar19 << 0x18);
    pcVar40 = (char *)&switchD_00138333::switchdataD_00140dac;
    pcVar15 = acStack_baf + lVar6 + -4;
    break;
  case 0xcf:
    uVar37 = *(ulong *)(pcVar17 + -1);
    pacVar8 = (char (*) [16])
              (uVar37 >> 0x38 | (uVar37 & 0xff000000000000) >> 0x28 |
               (uVar37 & 0xff0000000000) >> 0x18 | (uVar37 & 0xff00000000) >> 8 |
               (uVar37 & 0xff000000) << 8 | (uVar37 & 0xff0000) << 0x18 | (uVar37 & 0xff00) << 0x28
              | uVar37 << 0x38);
    pcVar40 = (char *)&switchD_00138333::switchdataD_00140dac;
    pcVar15 = acStack_baf + lVar6;
    break;
  default:
    if (-1 < (char)bVar10) {
      pcVar15 = acStack_baf + lVar6 + -8;
      break;
    }
LAB_001385c6:
    pcStack_bf0 = (code *)0x1385cb;
    test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
    goto LAB_001385cb;
  }
  if (pacVar8 != pacStack_bd8) {
LAB_0013861d:
    pcStack_bf0 = test_read_num<double,int,int(*)(char_const**,double*)>;
    test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
    iVar2 = (int)pacVar11;
    builtin_strncpy(acStack_d20,"typed read of ",0xf);
    pcStack_e50 = (code *)(long)iVar2;
    if (iVar2 < 0) {
      pcVar32 = "%lld";
      pcVar13 = pcStack_e50;
    }
    else {
      pcVar32 = "%llu";
      pcVar13 = (code *)((ulong)pacVar11 & 0xffffffff);
    }
    pcStack_e58 = (code *)0x1386a4;
    pacStack_e28 = (char (*) [16])pcVar40;
    pacStack_c18 = (char (*) [16])pcVar22;
    pcStack_c10 = pcVar15;
    pcStack_c08 = pcVar17;
    pacStack_c00 = (char (*) [16])puVar28;
    lStack_bf8 = lVar5;
    pcStack_bf0 = (code *)(&bStack_bb8 + lVar6);
    iVar3 = snprintf(acStack_d20 + 0xe,0xf2,pcVar32,pcVar13);
    pcVar15 = acStack_d20 + 0xe + iVar3;
    iVar4 = 0;
    pcStack_e58 = (code *)0x1386c3;
    iVar3 = snprintf(pcVar15,(size_t)(auStack_c20 + -(long)pcVar15)," into ");
    puVar24 = auStack_c20 + -(long)(pcVar15 + iVar3);
    pcStack_e58 = (code *)0x1386dd;
    snprintf(pcVar15 + iVar3,(size_t)puVar24,"double");
    pcStack_e58 = (code *)0x1386ec;
    _space((FILE *)_stdout);
    pcStack_e58 = (code *)0x138705;
    fwrite("# ",2,1,_stdout);
    pcStack_e58 = (code *)0x138715;
    fputs(acStack_d20,_stdout);
    pcStack_e58 = (code *)0x138722;
    fputc(10,_stdout);
    if (-1 < iVar2) {
      pcStack_e58 = (code *)0x138733;
      iVar4 = test_encode_uint_all_sizes
                        ((char (*) [16])&bStack_e20,(uint64_t)((ulong)pacVar11 & 0xffffffff));
    }
    pcVar40 = (char *)(&bStack_e20 + (long)iVar4 * 0x10);
    pcStack_e58 = (code *)0x138751;
    pcVar15 = (char *)pcStack_e50;
    iVar3 = test_encode_int_all_sizes((char (*) [16])pcVar40,(int64_t)pcStack_e50);
    uVar19 = iVar4 + iVar3;
    if (uVar19 == 0 || SCARRY4(iVar4,iVar3) != (int)uVar19 < 0) {
      return;
    }
    fStack_e44 = (float)iVar2;
    dStack_e40 = (double)iVar2;
    uVar37 = (ulong)uVar19;
    puVar36 = (undefined8 *)(auStack_e1f + 1);
    pcVar17 = 
    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
    lVar5 = 0;
    goto LAB_00138782;
  }
LAB_0013840f:
  switch(bVar10) {
  case 0xcc:
    pacVar30 = (char (*) [16])(ulong)(byte)pcVar17[-1];
    goto LAB_0013843d;
  case 0xcd:
    pcVar25 = acStack_baf + lVar6 + -6;
    pacVar30 = (char (*) [16])
               (ulong)(ushort)(*(ushort *)(pcVar17 + -1) << 8 | *(ushort *)(pcVar17 + -1) >> 8);
    break;
  case 0xce:
    uVar19 = *(uint *)(pcVar17 + -1);
    pacVar30 = (char (*) [16])
               (ulong)(uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                      uVar19 << 0x18);
    pcVar25 = acStack_baf + lVar6 + -4;
    break;
  case 0xcf:
    uVar37 = *(ulong *)(pcVar17 + -1);
    pacVar30 = (char (*) [16])
               (uVar37 >> 0x38 | (uVar37 & 0xff000000000000) >> 0x28 |
                (uVar37 & 0xff0000000000) >> 0x18 | (uVar37 & 0xff00000000) >> 8 |
                (uVar37 & 0xff000000) << 8 | (uVar37 & 0xff0000) << 0x18 | (uVar37 & 0xff00) << 0x28
               | uVar37 << 0x38);
    if (-1 < (long)pacVar30) goto LAB_00138468;
LAB_0013837a:
    pacVar30 = (char (*) [16])0x0;
    iVar3 = 1;
    iVar2 = 0;
    pcVar25 = pcVar32;
    goto LAB_001384b7;
  case 0xd0:
    pacVar30 = (char (*) [16])(long)pcVar17[-1];
LAB_0013843d:
    pcVar25 = acStack_baf + lVar6 + -7;
    break;
  case 0xd1:
    pcVar25 = acStack_baf + lVar6 + -6;
    pacVar30 = (char (*) [16])
               (long)(short)(*(ushort *)(pcVar17 + -1) << 8 | *(ushort *)(pcVar17 + -1) >> 8);
    break;
  case 0xd2:
    uVar19 = *(uint *)(pcVar17 + -1);
    pcVar25 = acStack_baf + lVar6 + -4;
    pacVar30 = (char (*) [16])
               (long)(int)(uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                          uVar19 << 0x18);
    break;
  case 0xd3:
    uVar37 = *(ulong *)(pcVar17 + -1);
    pacVar30 = (char (*) [16])
               (uVar37 >> 0x38 | (uVar37 & 0xff000000000000) >> 0x28 |
                (uVar37 & 0xff0000000000) >> 0x18 | (uVar37 & 0xff00000000) >> 8 |
                (uVar37 & 0xff000000) << 8 | (uVar37 & 0xff0000) << 0x18 | (uVar37 & 0xff00) << 0x28
               | uVar37 << 0x38);
LAB_00138468:
    pcVar25 = acStack_baf + lVar6;
    break;
  default:
    if ((char)bVar10 < -0x20) goto LAB_0013837a;
    pcVar25 = acStack_baf + lVar6 + -8;
  }
  iVar2 = 1;
  iVar3 = 0;
LAB_001384b7:
  if ((char)iStack_bcc == '\0') {
    pcVar38 = 
    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
    pcStack_bf0 = (code *)0x138579;
    _ok(iVar3,"rc == -1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x737,"check failure for code 0x%02X",(ulong)(uint)(int)(char)bVar10);
    pacVar11 = (char (*) [16])(ulong)(pcVar32 == pcVar25);
    pcVar40 = "mp_num_pos2 == mp_nums[i]";
    pcStack_bf0 = (code *)0x13859f;
    _ok((uint)(pcVar32 == pcVar25),"mp_num_pos2 == mp_nums[i]",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x738,"check position");
  }
  else {
    pcStack_bf0 = (code *)0x1384ef;
    _ok(iVar2,"rc == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73b,"check success for code 0x%02X",(ulong)(uint)(int)(char)bVar10);
    pcVar32 = 
    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
    pcStack_bf0 = (code *)0x13851c;
    _ok((uint)(pcVar15 == pcVar25),"mp_num_pos1 == mp_num_pos2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73c,"check position");
    if ((long)pacVar30 < 0) {
LAB_001385cb:
      pcStack_bf0 = (code *)0x1385d0;
      test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
LAB_001385d0:
      pcStack_bf0 = (code *)0x1385ef;
      __assert_fail("c == 0xcb",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x987,"double mp_decode_double(const char **)");
    }
    pacVar11 = (char (*) [16])(ulong)(pacVar30 == pacStack_bd8);
    pcVar40 = "(uint64_t)num1 == (uint64_t)num2";
    pcStack_bf0 = (code *)0x13854d;
    _ok((uint)(pacVar30 == pacStack_bd8),"(uint64_t)num1 == (uint64_t)num2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x743,"check int number");
    pcVar38 = pcVar22;
  }
  lVar5 = lVar5 + 1;
  pcVar17 = pcVar17 + 0x10;
  pcVar22 = pcVar22 + -1;
  pcVar15 = pcVar32;
  puVar28 = (uint *)pcVar38;
  if (pcVar22 == (char *)0x0) {
    return;
  }
  goto LAB_00138274;
LAB_00138782:
  lVar6 = lVar5 * 0x10;
  bVar10 = *(byte *)((long)puVar36 + -2);
  pcVar13 = (code *)(ulong)bVar10;
  mVar1 = mp_type_hint[(long)pcVar13];
  puVar23 = puVar36;
  if (mVar1 == MP_UINT) {
    switch(bVar10) {
    case 0xcc:
      pcVar13 = (code *)(ulong)*(byte *)((long)puVar36 + -1);
      break;
    case 0xcd:
      pcVar13 = (code *)(ulong)(ushort)(*(ushort *)((long)puVar36 + -1) << 8 |
                                       *(ushort *)((long)puVar36 + -1) >> 8);
      puVar23 = (undefined8 *)((long)auStack_e17 + lVar6 + -6);
      break;
    case 0xce:
      uVar19 = *(uint *)((long)puVar36 + -1);
      pcVar13 = (code *)(ulong)(uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                               uVar19 << 0x18);
      puVar23 = (undefined8 *)((long)auStack_e17 + lVar6 + -4);
      break;
    case 0xcf:
      uVar16 = *(ulong *)((long)puVar36 + -1);
      pcVar13 = (code *)(uVar16 >> 0x38 | (uVar16 & 0xff000000000000) >> 0x28 |
                         (uVar16 & 0xff0000000000) >> 0x18 | (uVar16 & 0xff00000000) >> 8 |
                         (uVar16 & 0xff000000) << 8 | (uVar16 & 0xff0000) << 0x18 |
                         (uVar16 & 0xff00) << 0x28 | uVar16 << 0x38);
      puVar23 = auStack_e17 + lVar5 * 2;
      break;
    default:
      if ((char)bVar10 < '\0') {
LAB_001389dc:
        pcStack_e58 = (code *)0x1389e1;
        test_read_num<double,int,int(*)(char_const**,double*)>();
LAB_001389e1:
        pcStack_e58 = (code *)0x1389e6;
        test_read_num<double,int,int(*)(char_const**,double*)>();
LAB_001389e6:
        pcStack_e58 = (code *)0x138a05;
        __assert_fail("c == 0xcb",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x987,"double mp_decode_double(const char **)");
      }
      puVar23 = auStack_e17 + lVar5 * 2 + -1;
    }
    if (pcVar13 != pcStack_e50) {
      pcStack_e58 = (code *)0x138a2e;
      test_read_num<double,int,int(*)(char_const**,double*)>();
LAB_00138a2e:
      pcStack_e58 = test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>;
      test_read_num<double,int,int(*)(char_const**,double*)>();
      pcStack_e58 = (code *)0x1411a4;
      builtin_strncpy(acStack_f88,"typed read of ",0xf);
      pcStack_10c0 = (code *)0x138a9a;
      uStack_10a4 = extraout_EDX;
      pcStack_1090 = (code *)pcVar15;
      puStack_e80 = puVar23;
      uStack_e78 = uVar37;
      puStack_e70 = puVar36;
      lStack_e68 = lVar5;
      puStack_e60 = puVar24;
      iVar2 = snprintf(acStack_f88 + 0xe,0xf2,"%llu",pcVar40);
      pcVar15 = acStack_f88 + (long)iVar2 + 0xe;
      pcStack_10c0 = (code *)0x138abe;
      iVar2 = snprintf(pcVar15,(size_t)(auStack_e88 + -(long)pcVar15)," into ");
      pcStack_10c0 = (code *)0x138ad8;
      snprintf(pcVar15 + iVar2,(size_t)(auStack_e88 + -(long)(pcVar15 + iVar2)),"double");
      pcStack_10c0 = (code *)0x138ae7;
      _space((FILE *)_stdout);
      pcStack_10c0 = (code *)0x138b00;
      fwrite("# ",2,1,_stdout);
      pcStack_10c0 = (code *)0x138b10;
      fputs(acStack_f88,_stdout);
      pcStack_10c0 = (code *)0x138b1d;
      fputc(10,_stdout);
      pcStack_10c0 = (code *)0x138b2a;
      iVar2 = test_encode_uint_all_sizes((char (*) [16])&bStack_1088,(uint64_t)pcVar40);
      pacVar11 = (char (*) [16])(&bStack_1088 + (long)iVar2 * 0x10);
      pcStack_10c0 = (code *)0x138b48;
      pacStack_10b8 = (char (*) [16])pcVar40;
      iVar3 = test_encode_int_all_sizes(pacVar11,(int64_t)pcVar40);
      uVar19 = iVar2 + iVar3;
      if (uVar19 == 0 || SCARRY4(iVar2,iVar3) != (int)uVar19 < 0) {
        return;
      }
      fStack_10a8 = (float)(long)pacStack_10b8;
      dStack_10a0 = (double)(long)pacStack_10b8;
      uVar37 = (ulong)uVar19;
      pcVar22 = (char *)((long)&uStack_1087 + 1);
      lVar5 = 0;
      goto LAB_00138b77;
    }
  }
  else if (mVar1 == MP_FLOAT) {
    if (bVar10 != 0xca) {
LAB_00138a0a:
      pcStack_e58 = (code *)0x138a29;
      __assert_fail("c == 0xca",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x97e,"float mp_decode_float(const char **)");
    }
    uVar19 = *(uint *)((long)puVar36 + -1);
    fVar14 = (float)(uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                    uVar19 << 0x18);
    if ((fVar14 != fStack_e44) || (NAN(fVar14) || NAN(fStack_e44))) goto LAB_001389e1;
    puVar23 = (undefined8 *)((long)puVar36 + 3);
  }
  else if (mVar1 == MP_INT) {
    pcVar13 = (code *)(long)(char)bVar10;
    switch(bVar10) {
    case 0xd0:
      pcVar13 = (code *)(long)*(char *)((long)puVar36 + -1);
      pcVar15 = (char *)&switchD_001387d7::switchdataD_00140dfc;
      break;
    case 0xd1:
      pcVar13 = (code *)(long)(short)(*(ushort *)((long)puVar36 + -1) << 8 |
                                     *(ushort *)((long)puVar36 + -1) >> 8);
      puVar23 = (undefined8 *)((long)auStack_e17 + lVar6 + -6);
      pcVar15 = (char *)&switchD_001387d7::switchdataD_00140dfc;
      break;
    case 0xd2:
      uVar19 = *(uint *)((long)puVar36 + -1);
      pcVar13 = (code *)(long)(int)(uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 |
                                    (uVar19 & 0xff00) << 8 | uVar19 << 0x18);
      puVar23 = (undefined8 *)((long)auStack_e17 + lVar6 + -4);
      pcVar15 = (char *)&switchD_001387d7::switchdataD_00140dfc;
      break;
    case 0xd3:
      uVar16 = *(ulong *)((long)puVar36 + -1);
      pcVar13 = (code *)(uVar16 >> 0x38 | (uVar16 & 0xff000000000000) >> 0x28 |
                         (uVar16 & 0xff0000000000) >> 0x18 | (uVar16 & 0xff00000000) >> 8 |
                         (uVar16 & 0xff000000) << 8 | (uVar16 & 0xff0000) << 0x18 |
                         (uVar16 & 0xff00) << 0x28 | uVar16 << 0x38);
      puVar23 = auStack_e17 + lVar5 * 2;
      pcVar15 = (char *)&switchD_001387d7::switchdataD_00140dfc;
      break;
    default:
      if (bVar10 < 0xe0) {
        pcStack_e58 = (code *)0x1389dc;
        test_read_num<double,int,int(*)(char_const**,double*)>();
        goto LAB_001389dc;
      }
      puVar23 = auStack_e17 + lVar5 * 2 + -1;
    }
    if (pcVar13 != pcStack_e50) goto LAB_00138a2e;
  }
  else {
    if (bVar10 != 0xcb) goto LAB_001389e6;
    uVar16 = *(ulong *)((long)puVar36 + -1);
    dVar18 = (double)(uVar16 >> 0x38 | (uVar16 & 0xff000000000000) >> 0x28 |
                      (uVar16 & 0xff0000000000) >> 0x18 | (uVar16 & 0xff00000000) >> 8 |
                      (uVar16 & 0xff000000) << 8 | (uVar16 & 0xff0000) << 0x18 |
                      (uVar16 & 0xff00) << 0x28 | uVar16 << 0x38);
    if ((dVar18 != dStack_e40) || (NAN(dVar18) || NAN(dStack_e40))) {
      pcStack_e58 = (code *)0x138a0a;
      test_read_num<double,int,int(*)(char_const**,double*)>();
      goto LAB_00138a0a;
    }
    puVar23 = auStack_e17 + lVar5 * 2;
  }
  puStack_e30 = (undefined8 *)((long)puVar36 + -2);
  puVar24 = (undefined1 *)(ulong)(uint)(int)(char)bVar10;
  dStack_e38 = 0.0;
  pcStack_e58 = (code *)0x138922;
  iVar2 = (*(code *)pacStack_e28)(&puStack_e30,&dStack_e38);
  pcStack_e58 = (code *)0x13894a;
  _ok((uint)(iVar2 == 0),"rc == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73b,
      "check success for code 0x%02X",puVar24);
  pcStack_e58 = (code *)0x138972;
  _ok((uint)(puVar23 == puStack_e30),"mp_num_pos1 == mp_num_pos2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73c,
      "check position");
  bVar42 = ABS(dStack_e40 - dStack_e38) < 1e-15;
  pcVar40 = (char *)(ulong)bVar42;
  pcVar15 = "double_eq(num1, num2)";
  pcStack_e58 = (code *)0x1389b5;
  _ok((uint)bVar42,"double_eq(num1, num2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73e,
      "check float number");
  lVar5 = lVar5 + 1;
  puVar36 = puVar36 + 2;
  uVar37 = uVar37 - 1;
  if (uVar37 == 0) {
    return;
  }
  goto LAB_00138782;
LAB_00138b77:
  lVar6 = lVar5 * 0x10;
  bVar10 = pcVar22[-2];
  pacVar8 = (char (*) [16])(ulong)bVar10;
  mVar1 = mp_type_hint[(long)pacVar8];
  pcVar32 = pcVar22;
  if (mVar1 == MP_UINT) {
    switch(bVar10) {
    case 0xcc:
      pacVar8 = (char (*) [16])(ulong)(byte)pcVar22[-1];
      break;
    case 0xcd:
      pacVar8 = (char (*) [16])
                (ulong)(ushort)(*(ushort *)(pcVar22 + -1) << 8 | *(ushort *)(pcVar22 + -1) >> 8);
      pcVar32 = acStack_107f + lVar6 + -6;
      break;
    case 0xce:
      uVar19 = *(uint *)(pcVar22 + -1);
      pacVar8 = (char (*) [16])
                (ulong)(uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                       uVar19 << 0x18);
      pcVar32 = acStack_107f + lVar6 + -4;
      break;
    case 0xcf:
      uVar16 = *(ulong *)(pcVar22 + -1);
      pacVar8 = (char (*) [16])
                (uVar16 >> 0x38 | (uVar16 & 0xff000000000000) >> 0x28 |
                 (uVar16 & 0xff0000000000) >> 0x18 | (uVar16 & 0xff00000000) >> 8 |
                 (uVar16 & 0xff000000) << 8 | (uVar16 & 0xff0000) << 0x18 |
                 (uVar16 & 0xff00) << 0x28 | uVar16 << 0x38);
      pcVar32 = acStack_107f + lVar5 * 0x10;
      break;
    default:
      if ((char)bVar10 < '\0') {
LAB_00138e36:
        pcStack_10c0 = (code *)0x138e3b;
        test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
LAB_00138e3b:
        pcStack_10c0 = (code *)0x138e40;
        test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
LAB_00138e40:
        pcStack_10c0 = (code *)0x138e5f;
        __assert_fail("c == 0xcb",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x987,"double mp_decode_double(const char **)");
      }
      pcVar32 = acStack_107f + (lVar5 * 2 + -1) * 8;
    }
    if (pacVar8 != pacStack_10b8) {
      pcStack_10c0 = (code *)0x138e88;
      test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
LAB_00138e88:
      pcStack_10c0 = test_read_num<double,long_long,int(*)(char_const**,double*)>;
      test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
      builtin_strncpy(acStack_12f0,"typed read of ",0xf);
      pcStack_1328 = (code *)0x138ef1;
      uStack_130c = extraout_EDX_00;
      pacStack_12f8 = (char (*) [16])pcVar40;
      lStack_10e8 = lVar5;
      uStack_10e0 = uVar37;
      pcStack_10d8 = pcVar15;
      pcStack_10d0 = pcVar32;
      pcStack_10c8 = pcVar22;
      pcStack_10c0 = (code *)pcVar17;
      iVar2 = snprintf(acStack_12f0 + 0xe,0xf2,"%lld",pacVar11);
      pcVar15 = acStack_12f0 + (long)iVar2 + 0xe;
      pcStack_1328 = (code *)0x138f12;
      iVar2 = snprintf(pcVar15,(size_t)(&bStack_11f0 + -(long)pcVar15)," into ");
      pcStack_1328 = (code *)0x138f2c;
      snprintf(pcVar15 + iVar2,(size_t)(&bStack_11f0 + -(long)(pcVar15 + iVar2)),"double");
      pcStack_1328 = (code *)0x138f3b;
      _space((FILE *)_stdout);
      pcStack_1328 = (code *)0x138f54;
      fwrite("# ",2,1,_stdout);
      pcStack_1328 = (code *)0x138f61;
      fputs(acStack_12f0,_stdout);
      pcStack_1328 = (code *)0x138f6e;
      fputc(10,_stdout);
      pacVar8 = (char (*) [16])&bStack_11f0;
      pcStack_1328 = (code *)0x138f82;
      pacStack_1320 = pacVar11;
      uVar19 = test_encode_int_all_sizes(pacVar8,(int64_t)pacVar11);
      if ((int)uVar19 < 1) {
        return;
      }
      fStack_1310 = (float)(long)pacStack_1320;
      dStack_1308 = (double)(long)pacStack_1320;
      uVar37 = (ulong)uVar19;
      pcVar40 = (char *)((long)&uStack_11ef + 1);
      lVar5 = 0;
      goto LAB_00138fb4;
    }
  }
  else if (mVar1 == MP_FLOAT) {
    if (bVar10 != 0xca) {
LAB_00138e64:
      pcStack_10c0 = (code *)0x138e83;
      __assert_fail("c == 0xca",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x97e,"float mp_decode_float(const char **)");
    }
    uVar19 = *(uint *)(pcVar22 + -1);
    fVar14 = (float)(uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                    uVar19 << 0x18);
    if ((fVar14 != fStack_10a8) || (NAN(fVar14) || NAN(fStack_10a8))) goto LAB_00138e3b;
    pcVar32 = pcVar22 + 3;
  }
  else if (mVar1 == MP_INT) {
    pacVar8 = (char (*) [16])(long)(char)bVar10;
    switch(bVar10) {
    case 0xd0:
      pacVar8 = (char (*) [16])(long)pcVar22[-1];
      pcVar40 = (char *)&switchD_00138bcc::switchdataD_00140e1c;
      break;
    case 0xd1:
      pacVar8 = (char (*) [16])
                (long)(short)(*(ushort *)(pcVar22 + -1) << 8 | *(ushort *)(pcVar22 + -1) >> 8);
      pcVar40 = (char *)&switchD_00138bcc::switchdataD_00140e1c;
      pcVar32 = acStack_107f + lVar6 + -6;
      break;
    case 0xd2:
      uVar19 = *(uint *)(pcVar22 + -1);
      pacVar8 = (char (*) [16])
                (long)(int)(uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                           uVar19 << 0x18);
      pcVar40 = (char *)&switchD_00138bcc::switchdataD_00140e1c;
      pcVar32 = acStack_107f + lVar6 + -4;
      break;
    case 0xd3:
      uVar16 = *(ulong *)(pcVar22 + -1);
      pacVar8 = (char (*) [16])
                (uVar16 >> 0x38 | (uVar16 & 0xff000000000000) >> 0x28 |
                 (uVar16 & 0xff0000000000) >> 0x18 | (uVar16 & 0xff00000000) >> 8 |
                 (uVar16 & 0xff000000) << 8 | (uVar16 & 0xff0000) << 0x18 |
                 (uVar16 & 0xff00) << 0x28 | uVar16 << 0x38);
      pcVar40 = (char *)&switchD_00138bcc::switchdataD_00140e1c;
      pcVar32 = acStack_107f + lVar5 * 0x10;
      break;
    default:
      if (bVar10 < 0xe0) {
        pcStack_10c0 = (code *)0x138e36;
        test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
        goto LAB_00138e36;
      }
      pcVar32 = acStack_107f + (lVar5 * 2 + -1) * 8;
    }
    if (pacVar8 != pacStack_10b8) goto LAB_00138e88;
  }
  else {
    if (bVar10 != 0xcb) goto LAB_00138e40;
    uVar16 = *(ulong *)(pcVar22 + -1);
    dVar18 = (double)(uVar16 >> 0x38 | (uVar16 & 0xff000000000000) >> 0x28 |
                      (uVar16 & 0xff0000000000) >> 0x18 | (uVar16 & 0xff00000000) >> 8 |
                      (uVar16 & 0xff000000) << 8 | (uVar16 & 0xff0000) << 0x18 |
                      (uVar16 & 0xff00) << 0x28 | uVar16 << 0x38);
    if ((dVar18 != dStack_10a0) || (NAN(dVar18) || NAN(dStack_10a0))) {
      pcStack_10c0 = (code *)0x138e64;
      test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
      goto LAB_00138e64;
    }
    pcVar32 = acStack_107f + lVar5 * 0x10;
  }
  pcVar17 = pcVar22 + -2;
  pcVar15 = (char *)(ulong)(uint)(int)(char)bVar10;
  dStack_1098 = 0.0;
  pcStack_10c0 = (code *)0x138d17;
  pcStack_10b0 = pcVar17;
  iVar2 = (*pcStack_1090)(&pcStack_10b0,&dStack_1098);
  if ((char)uStack_10a4 == '\0') {
    pcStack_10c0 = (code *)0x138de7;
    _ok((uint)(iVar2 == -1),"rc == -1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x737,"check failure for code 0x%02X",pcVar15);
    bVar42 = pcVar17 == pcStack_10b0;
    pcVar40 = "mp_num_pos2 == mp_nums[i]";
    iVar2 = 0x738;
    pcVar32 = "check position";
  }
  else {
    pcVar17 = 
    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
    pcStack_10c0 = (code *)0x138d51;
    _ok((uint)(iVar2 == 0),"rc == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73b,"check success for code 0x%02X",pcVar15);
    pcStack_10c0 = (code *)0x138d79;
    _ok((uint)(pcVar32 == pcStack_10b0),"mp_num_pos1 == mp_num_pos2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73c,"check position");
    bVar42 = ABS(dStack_10a0 - dStack_1098) < 1e-15;
    pcVar40 = "double_eq(num1, num2)";
    iVar2 = 0x73e;
    pcVar32 = "check float number";
  }
  pacVar11 = (char (*) [16])(ulong)bVar42;
  pcStack_10c0 = (code *)0x138e0f;
  _ok((uint)bVar42,pcVar40,
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",iVar2,
      pcVar32);
  lVar5 = lVar5 + 1;
  pcVar22 = pcVar22 + 0x10;
  uVar37 = uVar37 - 1;
  if (uVar37 == 0) {
    return;
  }
  goto LAB_00138b77;
LAB_00138fb4:
  lVar6 = lVar5 * 0x10;
  bVar10 = pcVar40[-2];
  pacVar11 = (char (*) [16])(ulong)bVar10;
  mVar1 = mp_type_hint[(long)pacVar11];
  pcVar22 = pcVar40;
  if (mVar1 == MP_UINT) {
    switch(bVar10) {
    case 0xcc:
      pacVar11 = (char (*) [16])(ulong)(byte)pcVar40[-1];
      break;
    case 0xcd:
      pacVar11 = (char (*) [16])
                 (ulong)(ushort)(*(ushort *)(pcVar40 + -1) << 8 | *(ushort *)(pcVar40 + -1) >> 8);
      pcVar22 = acStack_11e7 + lVar6 + -6;
      break;
    case 0xce:
      uVar19 = *(uint *)(pcVar40 + -1);
      pacVar11 = (char (*) [16])
                 (ulong)(uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                        uVar19 << 0x18);
      pcVar22 = acStack_11e7 + lVar6 + -4;
      break;
    case 0xcf:
      uVar16 = *(ulong *)(pcVar40 + -1);
      pacVar11 = (char (*) [16])
                 (uVar16 >> 0x38 | (uVar16 & 0xff000000000000) >> 0x28 |
                  (uVar16 & 0xff0000000000) >> 0x18 | (uVar16 & 0xff00000000) >> 8 |
                  (uVar16 & 0xff000000) << 8 | (uVar16 & 0xff0000) << 0x18 |
                  (uVar16 & 0xff00) << 0x28 | uVar16 << 0x38);
      pcVar22 = acStack_11e7 + lVar5 * 0x10;
      break;
    default:
      if ((char)bVar10 < '\0') {
LAB_00139276:
        pcStack_1328 = (code *)0x13927b;
        test_read_num<double,long_long,int(*)(char_const**,double*)>();
LAB_0013927b:
        pcStack_1328 = (code *)0x139280;
        test_read_num<double,long_long,int(*)(char_const**,double*)>();
LAB_00139280:
        pcStack_1328 = (code *)0x13929f;
        __assert_fail("c == 0xcb",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x987,"double mp_decode_double(const char **)");
      }
      pcVar22 = acStack_11e7 + (lVar5 * 2 + -1) * 8;
    }
    if (pacVar11 != pacStack_1320) {
      pcStack_1328 = (code *)0x1392c8;
      test_read_num<double,long_long,int(*)(char_const**,double*)>();
LAB_001392c8:
      pcStack_1328 = test_read_num<double,float,int(*)(char_const**,double*)>;
      test_read_num<double,long_long,int(*)(char_const**,double*)>();
      builtin_strncpy(acStack_1558,"typed read of ",0xf);
      uVar33 = CONCAT71((int7)(uVar37 >> 8),1);
      pcStack_1570 = (code *)0x13932e;
      lStack_1350 = lVar5;
      uStack_1348 = uVar37;
      pcStack_1340 = pcVar15;
      pcStack_1338 = pcVar22;
      pcStack_1330 = pcVar40;
      pcStack_1328 = (code *)pcVar17;
      iVar2 = snprintf(acStack_1558 + 0xe,0xf2,"%f",0x41590b2200000000);
      pcVar15 = acStack_1558 + (long)iVar2 + 0xe;
      pcStack_1570 = (code *)0x13934f;
      iVar2 = snprintf(pcVar15,(size_t)(abStack_1458 + -(long)pcVar15)," into ");
      pcStack_1570 = (code *)0x139369;
      snprintf(pcVar15 + iVar2,(size_t)(abStack_1458 + -(long)(pcVar15 + iVar2)),"double");
      puVar39 = &stdout;
      pcStack_1570 = (code *)0x139378;
      _space((FILE *)_stdout);
      pcStack_1570 = (code *)0x139391;
      fwrite("# ",2,1,_stdout);
      pcStack_1570 = (code *)0x13939e;
      fputs(acStack_1558,_stdout);
      pcVar13 = (code *)0xa;
      pcStack_1570 = (code *)0x1393ab;
      fputc(10,_stdout);
      abStack_1458[0] = 0xca;
      abStack_1458[1] = 0x4a;
      abStack_1458[2] = 200;
      abStack_1458[3] = 0x59;
      abStack_1458[4] = 0x10;
      abStack_1448[0] = 0xcb;
      abStack_1448[1] = 0x41;
      abStack_1448[2] = 0x59;
      abStack_1448[3] = 0xb;
      abStack_1448[4] = 0x22;
      abStack_1448[5] = 0;
      abStack_1448[6] = 0;
      abStack_1448[7] = 0;
      abStack_1448[8] = 0;
      pbVar9 = abStack_1458;
      goto LAB_001393db;
    }
  }
  else if (mVar1 == MP_FLOAT) {
    if (bVar10 != 0xca) {
LAB_001392a4:
      pcStack_1328 = (code *)0x1392c3;
      __assert_fail("c == 0xca",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x97e,"float mp_decode_float(const char **)");
    }
    uVar19 = *(uint *)(pcVar40 + -1);
    fVar14 = (float)(uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                    uVar19 << 0x18);
    if ((fVar14 != fStack_1310) || (NAN(fVar14) || NAN(fStack_1310))) goto LAB_0013927b;
    pcVar22 = pcVar40 + 3;
  }
  else if (mVar1 == MP_INT) {
    pacVar11 = (char (*) [16])(long)(char)bVar10;
    switch(bVar10) {
    case 0xd0:
      pacVar11 = (char (*) [16])(long)pcVar40[-1];
      break;
    case 0xd1:
      pacVar11 = (char (*) [16])
                 (long)(short)(*(ushort *)(pcVar40 + -1) << 8 | *(ushort *)(pcVar40 + -1) >> 8);
      pcVar22 = acStack_11e7 + lVar6 + -6;
      break;
    case 0xd2:
      uVar19 = *(uint *)(pcVar40 + -1);
      pacVar11 = (char (*) [16])
                 (long)(int)(uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                            uVar19 << 0x18);
      pcVar22 = acStack_11e7 + lVar6 + -4;
      break;
    case 0xd3:
      uVar16 = *(ulong *)(pcVar40 + -1);
      pacVar11 = (char (*) [16])
                 (uVar16 >> 0x38 | (uVar16 & 0xff000000000000) >> 0x28 |
                  (uVar16 & 0xff0000000000) >> 0x18 | (uVar16 & 0xff00000000) >> 8 |
                  (uVar16 & 0xff000000) << 8 | (uVar16 & 0xff0000) << 0x18 |
                  (uVar16 & 0xff00) << 0x28 | uVar16 << 0x38);
      pcVar22 = acStack_11e7 + lVar5 * 0x10;
      break;
    default:
      if (bVar10 < 0xe0) {
        pcStack_1328 = (code *)0x139276;
        test_read_num<double,long_long,int(*)(char_const**,double*)>();
        goto LAB_00139276;
      }
      pcVar22 = acStack_11e7 + (lVar5 * 2 + -1) * 8;
    }
    if (pacVar11 != pacStack_1320) goto LAB_001392c8;
  }
  else {
    if (bVar10 != 0xcb) goto LAB_00139280;
    uVar16 = *(ulong *)(pcVar40 + -1);
    dVar18 = (double)(uVar16 >> 0x38 | (uVar16 & 0xff000000000000) >> 0x28 |
                      (uVar16 & 0xff0000000000) >> 0x18 | (uVar16 & 0xff00000000) >> 8 |
                      (uVar16 & 0xff000000) << 8 | (uVar16 & 0xff0000) << 0x18 |
                      (uVar16 & 0xff00) << 0x28 | uVar16 << 0x38);
    if ((dVar18 != dStack_1308) || (NAN(dVar18) || NAN(dStack_1308))) {
      pcStack_1328 = (code *)0x1392a4;
      test_read_num<double,long_long,int(*)(char_const**,double*)>();
      goto LAB_001392a4;
    }
    pcVar22 = acStack_11e7 + lVar5 * 0x10;
  }
  pcVar17 = pcVar40 + -2;
  pcVar15 = (char *)(ulong)(uint)(int)(char)bVar10;
  dStack_1300 = 0.0;
  pcStack_1328 = (code *)0x139157;
  pcStack_1318 = pcVar17;
  iVar2 = (*(code *)pacStack_12f8)(&pcStack_1318,&dStack_1300);
  if ((char)uStack_130c == '\0') {
    pcStack_1328 = (code *)0x139227;
    _ok((uint)(iVar2 == -1),"rc == -1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x737,"check failure for code 0x%02X",pcVar15);
    bVar42 = pcVar17 == pcStack_1318;
    pcVar22 = "mp_num_pos2 == mp_nums[i]";
    iVar2 = 0x738;
    pcVar32 = "check position";
  }
  else {
    pcVar17 = 
    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
    pcStack_1328 = (code *)0x139191;
    _ok((uint)(iVar2 == 0),"rc == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73b,"check success for code 0x%02X",pcVar15);
    pcStack_1328 = (code *)0x1391b9;
    _ok((uint)(pcVar22 == pcStack_1318),"mp_num_pos1 == mp_num_pos2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73c,"check position");
    bVar42 = ABS(dStack_1308 - dStack_1300) < 1e-15;
    pcVar22 = "double_eq(num1, num2)";
    iVar2 = 0x73e;
    pcVar32 = "check float number";
  }
  pacVar8 = (char (*) [16])(ulong)bVar42;
  pcStack_1328 = (code *)0x13924f;
  _ok((uint)bVar42,pcVar22,
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",iVar2,
      pcVar32);
  lVar5 = lVar5 + 1;
  pcVar40 = pcVar40 + 0x10;
  uVar37 = uVar37 - 1;
  if (uVar37 == 0) {
    return;
  }
  goto LAB_00138fb4;
LAB_001393db:
  bVar10 = *pbVar9;
  uVar37 = (ulong)bVar10;
  mVar1 = mp_type_hint[uVar37];
  if (mVar1 == MP_UINT) {
    if (bVar10 == 0xce) {
      uVar19 = *(uint *)(pbVar9 + 1);
      uVar16 = (ulong)(uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                      uVar19 << 0x18);
      pbVar41 = pbVar9 + 5;
LAB_001394a6:
      if (uVar16 == 0x642c88) goto LAB_001394cd;
    }
    else {
      if (bVar10 == 0xcf) {
        uVar16 = *(ulong *)(pbVar9 + 1);
        uVar16 = uVar16 >> 0x38 | (uVar16 & 0xff000000000000) >> 0x28 |
                 (uVar16 & 0xff0000000000) >> 0x18 | (uVar16 & 0xff00000000) >> 8 |
                 (uVar16 & 0xff000000) << 8 | (uVar16 & 0xff0000) << 0x18 |
                 (uVar16 & 0xff00) << 0x28 | uVar16 << 0x38;
        pbVar41 = pbVar9 + 9;
        goto LAB_001394a6;
      }
      if ((1 < bVar10 - 0xcc) && ((char)bVar10 < '\0')) {
        pcStack_1570 = (code *)0x139617;
        test_read_num<double,float,int(*)(char_const**,double*)>();
        goto LAB_00139617;
      }
    }
    pcStack_1570 = (code *)0x1395b5;
    test_read_num<double,float,int(*)(char_const**,double*)>();
    bVar10 = (byte)uVar37;
    uVar19 = extraout_EDX_01;
LAB_001395b5:
    if ((1 < uVar19 - 0xd0) && (bVar10 < 0xe0)) {
LAB_00139617:
      pcStack_1570 = test_read_num<double,double,int(*)(char_const**,double*)>;
      test_read_num<double,float,int(*)(char_const**,double*)>();
      builtin_strncpy(acStack_1790,"typed read of ",0xf);
      pacStack_1588 = pacVar8;
      uStack_1580 = uVar33;
      puStack_1578 = puVar39;
      pcStack_1570 = (code *)abStack_1448;
      iVar2 = snprintf(acStack_1790 + 0xe,0xf2,"%lf",0xc0163851eb851eb8);
      pcVar15 = acStack_1790 + (long)iVar2 + 0xe;
      iVar2 = snprintf(pcVar15,(size_t)(&uStack_1690 + -(long)pcVar15)," into ");
      snprintf(pcVar15 + iVar2,(size_t)(&uStack_1690 + -(long)(pcVar15 + iVar2)),"double");
      _space((FILE *)_stdout);
      fwrite("# ",2,1,_stdout);
      fputs(acStack_1790,_stdout);
      fputc(10,_stdout);
      puStack_1798 = &uStack_1690;
      uStack_1690 = 0xcb;
      uStack_168f = 0xb81e85eb513816c0;
      dStack_17a0 = 0.0;
      iVar2 = (*pcVar13)(&puStack_1798,&dStack_17a0);
      _ok((uint)(iVar2 == 0),"rc == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x73b,"check success for code 0x%02X",0xffffffcb);
      _ok((uint)(auStack_1687 == puStack_1798),"mp_num_pos1 == mp_num_pos2",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x73c,"check position");
      _ok((uint)(ABS(-5.555 - dStack_17a0) < 1e-15),"double_eq(num1, num2)",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x73e,"check float number");
      return;
    }
LAB_001395c5:
    pcStack_1570 = (code *)0x1395ca;
    test_read_num<double,float,int(*)(char_const**,double*)>();
LAB_001395ca:
    pcStack_1570 = (code *)0x1395cf;
    test_read_num<double,float,int(*)(char_const**,double*)>();
LAB_001395cf:
    pcStack_1570 = (code *)0x1395ee;
    __assert_fail("c == 0xcb",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                  ,0x987,"double mp_decode_double(const char **)");
  }
  if (mVar1 == MP_FLOAT) {
    if (bVar10 != 0xca) {
LAB_001395f3:
      pcStack_1570 = (code *)0x139612;
      __assert_fail("c == 0xca",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x97e,"float mp_decode_float(const char **)");
    }
    uVar19 = *(uint *)(pbVar9 + 1);
    fVar14 = (float)(uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                    uVar19 << 0x18);
    if ((fVar14 == 6.565e+06) && (!NAN(fVar14))) {
      pbVar41 = pbVar9 + 5;
      goto LAB_001394cd;
    }
    goto LAB_001395ca;
  }
  if (mVar1 == MP_INT) {
    if (bVar10 != 0xd2) {
      uVar19 = (uint)bVar10;
      if (bVar10 == 0xd3) {
        uVar37 = *(ulong *)(pbVar9 + 1);
        uVar37 = uVar37 >> 0x38 | (uVar37 & 0xff000000000000) >> 0x28 |
                 (uVar37 & 0xff0000000000) >> 0x18 | (uVar37 & 0xff00000000) >> 8 |
                 (uVar37 & 0xff000000) << 8 | (uVar37 & 0xff0000) << 0x18 |
                 (uVar37 & 0xff00) << 0x28 | uVar37 << 0x38;
        pbVar41 = pbVar9 + 9;
        goto LAB_001394c0;
      }
      goto LAB_001395b5;
    }
    uVar19 = *(uint *)(pbVar9 + 1);
    pbVar41 = pbVar9 + 5;
    uVar37 = (ulong)(int)(uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                         uVar19 << 0x18);
LAB_001394c0:
    if (uVar37 == 0x642c88) goto LAB_001394cd;
    goto LAB_001395c5;
  }
  if (bVar10 != 0xcb) goto LAB_001395cf;
  uVar37 = *(ulong *)(pbVar9 + 1);
  dVar18 = (double)(uVar37 >> 0x38 | (uVar37 & 0xff000000000000) >> 0x28 |
                    (uVar37 & 0xff0000000000) >> 0x18 | (uVar37 & 0xff00000000) >> 8 |
                    (uVar37 & 0xff000000) << 8 | (uVar37 & 0xff0000) << 0x18 |
                    (uVar37 & 0xff00) << 0x28 | uVar37 << 0x38);
  if ((dVar18 != 6565000.0) || (NAN(dVar18))) {
    pcStack_1570 = (code *)0x1395f3;
    test_read_num<double,float,int(*)(char_const**,double*)>();
    goto LAB_001395f3;
  }
  pbVar41 = pbVar9 + 9;
LAB_001394cd:
  puVar39 = (undefined *)(ulong)(uint)(int)(char)bVar10;
  dStack_1568 = 0.0;
  pcStack_1570 = (code *)0x1394e8;
  pbStack_1560 = pbVar9;
  iVar2 = (*(code *)pacVar8)(&pbStack_1560,&dStack_1568);
  pcStack_1570 = (code *)0x139510;
  _ok((uint)(iVar2 == 0),"rc == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73b,
      "check success for code 0x%02X",puVar39);
  pcStack_1570 = (code *)0x139538;
  _ok((uint)(pbVar41 == pbStack_1560),"mp_num_pos1 == mp_num_pos2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73c,
      "check position");
  bVar42 = ABS(6565000.0 - dStack_1568) < 1e-15;
  pcVar13 = (code *)(ulong)bVar42;
  pcStack_1570 = (code *)0x13957c;
  _ok((uint)bVar42,"double_eq(num1, num2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73e,
      "check float number");
  cVar31 = (char)uVar33;
  uVar33 = 0;
  pbVar9 = abStack_1448;
  if (cVar31 == '\0') {
    return;
  }
  goto LAB_001393db;
}

Assistant:

static void
test_read_num(ValueT num1, ReadF read_f, bool is_ok)
{
	/*
	 * Build the header message.
	 */
	const int str_cap = 256;
	char str[str_cap];
	char *end = str + str_cap;
	char *pos = str + snprintf(str, str_cap, "typed read of ");
	if (std::is_same<ValueT, float>::value)
		pos += snprintf(pos, end - pos, "%f", (float)num1);
	else if (std::is_same<ValueT, double>::value)
		pos += snprintf(pos, end - pos, "%lf", (double)num1);
	else if (num1 >= 0)
		pos += snprintf(pos, end - pos, "%llu", (long long)num1);
	else
		pos += snprintf(pos, end - pos, "%lld", (long long)num1);
	pos += snprintf(pos, end - pos, " into ");

	static_assert(!std::is_same<TargetT, float>::value,
		      "no float reading");
	if (std::is_integral<TargetT>::value) {
		pos += snprintf(pos, end - pos, "int%zu_t",
				sizeof(TargetT) * 8);
	} else {
		pos += snprintf(pos, end - pos, "double");
	}
	note("%s", str);
	/*
	 * Perform the actual tests.
	 */
	char mp_nums[MP_NUMBER_CODEC_COUNT][MP_NUMBER_MAX_LEN];
	int count = 0;
	if (std::is_integral<ValueT>::value) {
		if (num1 >= 0) {
			count += test_encode_uint_all_sizes(
				&mp_nums[count], num1);
		}
		if (num1 <= INT64_MAX) {
			count += test_encode_int_all_sizes(
				&mp_nums[count], num1);
		}
	} else if (!std::is_integral<TargetT>::value || !is_ok) {
		/*
		 * Only encode floating point types when
		 * 1) expect to also decode them back successfully.
		 * 2) want to fail to decode an integer.
		 *
		 * Encoding integers as floats for decoding them back into
		 * integers won't work.
		 */
		if (std::is_same<ValueT, float>::value)
			mp_encode_float(mp_nums[count++], (float)num1);
		mp_encode_double(mp_nums[count++], (double)num1);
	}
	for (int i = 0; i < count; ++i) {
		const char *mp_num_pos1 = mp_nums[i];
		char code = *mp_num_pos1;
		/* Sanity check of the test encoding. */
		if (mp_typeof(*mp_num_pos1) == MP_INT) {
			fail_unless(mp_decode_int(&mp_num_pos1) ==
				    (int64_t)num1);
		} else if (mp_typeof(*mp_num_pos1) == MP_UINT) {
			fail_unless(mp_decode_uint(&mp_num_pos1) ==
				    (uint64_t)num1);
		} else if (mp_typeof(*mp_num_pos1) == MP_FLOAT) {
			fail_unless(mp_decode_float(&mp_num_pos1) ==
				    (float)num1);
		} else {
			fail_unless(mp_decode_double(&mp_num_pos1) ==
				    (double)num1);
		}

		const char *mp_num_pos2 = mp_nums[i];
		TargetT num2 = 0;
		int rc = read_f(&mp_num_pos2, &num2);
		if (!is_ok) {
			is(rc, -1, "check failure for code 0x%02X", code);
			is(mp_num_pos2, mp_nums[i], "check position");
			continue;
		}
		is(rc, 0, "check success for code 0x%02X", code);
		is(mp_num_pos1, mp_num_pos2, "check position");
		if (!std::is_integral<TargetT>::value) {
			ok(double_eq(num1, num2), "check float number");
			continue;
		}
		if (num1 >= 0) {
			fail_unless(num2 >= 0);
			is((uint64_t)num1, (uint64_t)num2, "check int number");
		} else {
			fail_unless(num2 < 0);
			is((int64_t)num1, (int64_t)num2, "check int number");
		}
	}
}